

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_seek_test(void)

{
  uint8_t *puVar1;
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_file_handle *pfVar2;
  avl_node *paVar3;
  btree_iterator *pbVar4;
  btree *pbVar5;
  size_t *psVar6;
  size_t keylen;
  filemgr *keylen_00;
  btreeblk_handle *pbVar7;
  fdb_config *pfVar8;
  long lVar9;
  undefined1 *puVar10;
  fdb_status fVar11;
  int iVar12;
  fdb_iterator *pfVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_handle *pfVar18;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle *pfVar20;
  ulong uVar21;
  atomic<unsigned_char> *fconfig_00;
  fdb_doc *pfVar22;
  list *doc;
  btreeblk_handle *pbVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  undefined1 *puVar48;
  char *pcVar49;
  char *pcVar50;
  fdb_iterator *pfVar51;
  char *pcVar52;
  char *pcVar53;
  fdb_doc *unaff_R12;
  long lVar54;
  fdb_doc *pfVar55;
  char *unaff_R13;
  ulong uVar56;
  void *pvVar57;
  uint uVar58;
  bool bVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  uint8_t auStackY_11b99 [1805];
  fdb_commit_opt_t afStackY_1148c [4132];
  fdb_kvs_handle afStack_10458 [125];
  undefined8 uStack_4f0;
  undefined1 auStack_4d8 [8];
  undefined1 local_4d0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  undefined1 local_d0 [8];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  void *local_a0;
  fdb_doc *local_98 [6];
  fdb_doc *local_68;
  fdb_doc *local_60;
  fdb_kvs_handle *local_58;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  
  pcVar49 = &stack0xfffffffffffffff8;
  puVar24 = auStack_4d8;
  puVar25 = auStack_4d8;
  puVar26 = auStack_4d8;
  puVar27 = auStack_4d8;
  puVar28 = auStack_4d8;
  puVar29 = auStack_4d8;
  puVar30 = auStack_4d8;
  puVar31 = auStack_4d8;
  puVar32 = auStack_4d8;
  puVar33 = auStack_4d8;
  puVar34 = auStack_4d8;
  puVar35 = auStack_4d8;
  puVar36 = auStack_4d8;
  puVar37 = auStack_4d8;
  puVar38 = auStack_4d8;
  puVar39 = auStack_4d8;
  puVar40 = auStack_4d8;
  puVar41 = auStack_4d8;
  puVar42 = auStack_4d8;
  puVar43 = auStack_4d8;
  puVar44 = auStack_4d8;
  puVar45 = auStack_4d8;
  puVar46 = auStack_4d8;
  puVar47 = auStack_4d8;
  puVar48 = auStack_4d8;
  pfVar20 = (fdb_kvs_handle *)auStack_4d8;
  pfVar19 = (fdb_kvs_handle *)auStack_4d8;
  gettimeofday((timeval *)local_d0,(__timezone_ptr_t)0x0);
  memleak_start();
  iterator = (fdb_iterator *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  pfVar13 = (fdb_iterator *)&__test_begin.tv_usec;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  pcVar50 = (char *)&kv1;
  fdb_open((fdb_file_handle **)pcVar50,"./iterator_test1",(fdb_config *)local_4d0);
  pfVar18 = (fdb_kvs_handle *)&dbfile;
  fdb_kvs_open_default((fdb_file_handle *)kv1,(fdb_kvs_handle **)pfVar18,(fdb_kvs_config *)pfVar13);
  fVar11 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"iterator_seek_test");
  pfVar17 = (fdb_kvs_handle *)auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113064;
  fVar11 = fdb_kvs_open((fdb_file_handle *)kv1,&local_58,"kv1",
                        (fdb_kvs_config *)&__test_begin.tv_usec);
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113069;
  pfVar17 = (fdb_kvs_handle *)0x0;
  pcVar50 = (char *)0x0;
  do {
    sprintf(bodybuf + 0xf8,"kEy%d",(ulong)pcVar50 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"mEta%d",(ulong)pcVar50 & 0xffffffff);
    sprintf(metabuf + 0xf8,"bOdy%d",(ulong)pcVar50 & 0xffffffff);
    unaff_R13 = (char *)((long)&kvs_config.custom_cmp_param + (long)pfVar17);
    pfVar13 = (fdb_iterator *)strlen(bodybuf + 0xf8);
    unaff_R12 = (fdb_doc *)strlen((char *)&fconfig.num_blocks_readahead);
    sVar14 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x1122f0;
    fdb_doc_create((fdb_doc **)unaff_R13,bodybuf + 0xf8,(size_t)pfVar13,
                   &fconfig.num_blocks_readahead,(size_t)unaff_R12,metabuf + 0xf8,sVar14);
    fVar11 = fdb_set(local_58,(fdb_doc *)(&kvs_config.custom_cmp_param)[(long)pcVar50]);
    if (fVar11 != FDB_RESULT_SUCCESS) {
      iterator_seek_test();
      goto LAB_00113013;
    }
    fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[(long)pcVar50]);
    pcVar50 = &(((fdb_kvs_handle *)pcVar50)->kvs_config).field_0x1;
    pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).custom_cmp;
  } while (pcVar50 != (undefined1 *)0xa);
  lVar54 = 8;
  uVar21 = 1;
  do {
    sprintf(bodybuf + 0xf8,"key%d",uVar21 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar21 & 0xffffffff);
    sprintf(metabuf + 0xf8,"body%d",uVar21 & 0xffffffff);
    sVar14 = strlen(bodybuf + 0xf8);
    sVar15 = strlen((char *)&fconfig.num_blocks_readahead);
    sVar16 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x1123da;
    fdb_doc_create((fdb_doc **)((long)&kvs_config.custom_cmp_param + lVar54),bodybuf + 0xf8,sVar14,
                   &fconfig.num_blocks_readahead,sVar15,metabuf + 0xf8,sVar16);
    fdb_set((fdb_kvs_handle *)dbfile,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar21]);
    lVar54 = lVar54 + 0x10;
    bVar59 = uVar21 < 8;
    uVar21 = uVar21 + 2;
  } while (bVar59);
  fdb_commit((fdb_file_handle *)kv1,'\x01');
  lVar54 = 0;
  uVar21 = 0;
  do {
    sprintf(bodybuf + 0xf8,"key%d",uVar21 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar21 & 0xffffffff);
    sprintf(metabuf + 0xf8,"body%d",uVar21 & 0xffffffff);
    unaff_R13 = (char *)((long)&kvs_config.custom_cmp_param + lVar54);
    pfVar13 = (fdb_iterator *)strlen(bodybuf + 0xf8);
    unaff_R12 = (fdb_doc *)strlen((char *)&fconfig.num_blocks_readahead);
    sVar14 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x1124ba;
    fdb_doc_create((fdb_doc **)unaff_R13,bodybuf + 0xf8,(size_t)pfVar13,
                   &fconfig.num_blocks_readahead,(size_t)unaff_R12,metabuf + 0xf8,sVar14);
    fdb_set((fdb_kvs_handle *)dbfile,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar21]);
    pcVar50 = (char *)(uVar21 + 2);
    lVar54 = lVar54 + 0x10;
    bVar59 = uVar21 < 8;
    uVar21 = (ulong)pcVar50;
  } while (bVar59);
  fdb_commit((fdb_file_handle *)kv1,'\0');
  uStack_4f0 = 0x11250f;
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar17 = (fdb_kvs_handle *)iterator;
  pfVar22 = (fdb_doc *)kvs_config.custom_cmp_param;
  pfVar18 = (fdb_kvs_handle *)&db;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011306e;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_00113073;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_start;
  pcVar50 = *(char **)((long)pfVar22 + 0x38);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_0011307e;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_prev;
  pcVar50 = *(char **)((long)pfVar22 + 0x40);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->seqtree_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_00113089;
  fdb_doc_free((fdb_doc *)pfVar17);
  pfVar17 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar13 = (fdb_iterator *)local_98[0]->key;
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar17,pfVar13,sVar14,'\0');
  if (fVar11 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113094;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar18 = (fdb_kvs_handle *)iterator;
  pfVar55 = local_98[0];
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113099;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_98[0]->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  if (iVar12 != 0) goto LAB_0011309e;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_start;
  pcVar50 = (char *)pfVar55->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->hbtrie_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001130a9;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_prev;
  pcVar50 = (char *)pfVar55->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->seqtree_iterator);
  if (iVar12 != 0) goto LAB_001130b4;
  fdb_doc_free((fdb_doc *)pfVar18);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_next((fdb_iterator *)db);
  puVar10 = auStack_4d8;
  if (fVar11 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130bf;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar17 = (fdb_kvs_handle *)iterator;
  pfVar22 = local_98[1];
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001130c4;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_98[1]->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001130c9;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_start;
  pcVar50 = (char *)pfVar22->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_001130d4;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_prev;
  pcVar50 = (char *)pfVar22->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->seqtree_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001130df;
  fdb_doc_free((fdb_doc *)pfVar17);
  pfVar17 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar13 = (fdb_iterator *)local_60->key;
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar17,pfVar13,sVar14,'\0');
  if (fVar11 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001130ea;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar18 = (fdb_kvs_handle *)iterator;
  pfVar55 = local_60;
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001130ef;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_60->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  if (iVar12 != 0) goto LAB_001130f4;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_start;
  pcVar50 = (char *)pfVar55->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->hbtrie_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001130ff;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_prev;
  pcVar50 = (char *)pfVar55->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->seqtree_iterator);
  if (iVar12 != 0) goto LAB_0011310a;
  fdb_doc_free((fdb_doc *)pfVar18);
  pfVar18 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar13 = *(fdb_iterator **)((long)kvs_config.custom_cmp_param + 0x20);
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pfVar13,sVar14,'\0');
  puVar10 = auStack_4d8;
  if (fVar11 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113115;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar17 = (fdb_kvs_handle *)iterator;
  unaff_R12 = (fdb_doc *)kvs_config.custom_cmp_param;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011311a;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_0011311f;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_start;
  pcVar50 = *(char **)((long)unaff_R12 + 0x38);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_0011312a;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_prev;
  pcVar50 = *(char **)((long)unaff_R12 + 0x40);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->seqtree_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_00113135;
  fdb_doc_free((fdb_doc *)pfVar17);
  pfVar17 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar13 = (fdb_iterator *)local_98[0]->key;
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar17,pfVar13,sVar14,'\0');
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113140;
  unaff_R13 = (char *)0x2;
  pfVar51 = pfVar13;
  do {
    fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar13 = iterator;
    pfVar18 = pfVar17;
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011301e;
    pcVar50 = (char *)iterator->_seqnum;
    pfVar17 = (fdb_kvs_handle *)(&kvs_config.custom_cmp_param)[(long)unaff_R13];
    unaff_R12 = (fdb_doc *)pfVar17->op_stats;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)iterator->handle);
    if (iVar12 != 0) goto LAB_00113013;
    pcVar50 = (char *)pfVar13->tree_cursor_start;
    unaff_R12 = (fdb_doc *)pfVar17->staletree;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)pfVar13->hbtrie_iterator);
    pfVar18 = pfVar17;
    if (iVar12 != 0) goto LAB_0011302e;
    pcVar50 = (char *)pfVar13->tree_cursor_prev;
    unaff_R12 = (fdb_doc *)(pfVar17->field_6).seqtree;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)pfVar13->seqtree_iterator);
    if (iVar12 != 0) goto LAB_00113023;
    fdb_doc_free((fdb_doc *)pfVar13);
    iterator = (fdb_iterator *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    fVar11 = fdb_iterator_next((fdb_iterator *)db);
    pfVar18 = db;
    pfVar51 = pfVar13;
  } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
  puVar10 = auStack_4d8;
  if ((uint8_t *)unaff_R13 != (uint8_t *)0xa) goto LAB_00113145;
  pfVar13 = (fdb_iterator *)local_98[1]->key;
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pfVar13,sVar14,'\0');
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
  unaff_R13 = (char *)0x3;
  pfVar51 = pfVar13;
  do {
    fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar13 = iterator;
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113044;
    pcVar50 = (char *)iterator->_seqnum;
    pfVar18 = (fdb_kvs_handle *)(&kvs_config.custom_cmp_param)[(long)unaff_R13];
    unaff_R12 = (fdb_doc *)pfVar18->op_stats;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)iterator->handle);
    if (iVar12 != 0) goto LAB_00113039;
    pcVar50 = (char *)pfVar13->tree_cursor_start;
    unaff_R12 = (fdb_doc *)pfVar18->staletree;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)pfVar13->hbtrie_iterator);
    if (iVar12 != 0) goto LAB_00113054;
    pcVar50 = (char *)pfVar13->tree_cursor_prev;
    unaff_R12 = (fdb_doc *)(pfVar18->field_6).seqtree;
    iVar12 = bcmp(pcVar50,unaff_R12,(size_t)pfVar13->seqtree_iterator);
    if (iVar12 != 0) goto LAB_00113049;
    fdb_doc_free((fdb_doc *)pfVar13);
    iterator = (fdb_iterator *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    fVar11 = fdb_iterator_next((fdb_iterator *)db);
    pfVar51 = pfVar13;
  } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
  puVar10 = auStack_4d8;
  if ((uint8_t *)unaff_R13 != (uint8_t *)0xa) goto LAB_0011314f;
  pfVar18 = (fdb_kvs_handle *)&db;
  fdb_iterator_close((fdb_iterator *)db);
  pfVar13 = (fdb_iterator *)(bodybuf + 0xf8);
  sprintf((char *)pfVar13,"key%d",4);
  unaff_R12 = (fdb_doc *)&fconfig.num_blocks_readahead;
  sprintf((char *)unaff_R12,"key%d",8);
  pcVar50 = (char *)dbfile;
  unaff_R13 = (char *)strlen((char *)pfVar13);
  sVar14 = strlen((char *)unaff_R12);
  uStack_4f0 = 0x112ac8;
  fVar11 = fdb_iterator_init((fdb_kvs_handle *)pcVar50,(fdb_iterator **)pfVar18,pfVar13,
                             (size_t)unaff_R13,unaff_R12,sVar14,2);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113154;
  fVar11 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113159;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar19 = (fdb_kvs_handle *)iterator;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_68->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  puVar10 = auStack_4d8;
  unaff_R12 = local_68;
  if (iVar12 != 0) goto LAB_00113163;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar19)->tree_cursor_start;
  pcVar50 = (char *)local_68->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar19)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_0011316e;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar19)->tree_cursor_prev;
  pcVar50 = (char *)local_68->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar19)->seqtree_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_00113179;
  fdb_doc_free((fdb_doc *)pfVar19);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113184;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar18 = (fdb_kvs_handle *)iterator;
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113189;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_98[2]->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  unaff_R12 = local_98[2];
  if (iVar12 != 0) goto LAB_0011318e;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_start;
  pcVar50 = (char *)local_98[2]->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->hbtrie_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_00113199;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_prev;
  pcVar50 = (char *)local_98[2]->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->seqtree_iterator);
  if (iVar12 != 0) goto LAB_001131a4;
  fdb_doc_free((fdb_doc *)pfVar18);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_close((fdb_iterator *)db);
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131af;
  uStack_4f0 = 0x112c3c;
  fVar11 = fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0
                             ,0,0);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131b4;
  fVar11 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131b9;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar17 = (fdb_kvs_handle *)iterator;
  pcVar52 = (char *)local_60;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131be;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_60->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001131c3;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_start;
  pcVar50 = (char *)((fdb_doc *)pcVar52)->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_001131ce;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_prev;
  pcVar50 = (char *)((fdb_doc *)pcVar52)->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar17)->seqtree_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001131d9;
  fdb_doc_free((fdb_doc *)pfVar17);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131e4;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar19 = (fdb_kvs_handle *)iterator;
  puVar10 = auStack_4d8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001131e9;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  pcVar52 = (char *)kvs_config.custom_cmp_param;
  if (iVar12 != 0) goto LAB_001131ee;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar19)->tree_cursor_start;
  pcVar50 = *(char **)((long)kvs_config.custom_cmp_param + 0x38);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar19)->hbtrie_iterator);
  puVar10 = auStack_4d8;
  if (iVar12 != 0) goto LAB_001131f9;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar19)->tree_cursor_prev;
  pcVar50 = *(char **)((long)kvs_config.custom_cmp_param + 0x40);
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar19)->seqtree_iterator);
  if (iVar12 != 0) goto LAB_00113204;
  fdb_doc_free((fdb_doc *)pfVar19);
  iterator = (fdb_iterator *)0x0;
  pfVar19 = afStack_10458;
  memset(pfVar19,0xff,0xff80);
  fVar11 = fdb_iterator_seek((fdb_iterator *)db,pfVar19,0xff80,'\x01');
  pfVar20 = pfVar19;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011320f;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar18 = (fdb_kvs_handle *)iterator;
  pfVar17 = pfVar19;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113214;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_60->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  pcVar52 = (char *)local_60;
  if (iVar12 != 0) goto LAB_00113219;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_start;
  pcVar50 = (char *)local_60->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_00113224;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar18)->tree_cursor_prev;
  pcVar50 = (char *)local_60->body;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar18)->seqtree_iterator);
  if (iVar12 != 0) goto LAB_0011322f;
  fdb_doc_free((fdb_doc *)pfVar18);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_close((fdb_iterator *)db);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011323a;
  pfVar18 = (fdb_kvs_handle *)0xfffffffffffffffe;
  do {
    fVar11 = fdb_del((fdb_kvs_handle *)dbfile,local_98[(long)pfVar18]);
    unaff_R12 = local_60;
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
  } while (pfVar18 < (undefined1 *)0x8);
  fdb_commit((fdb_file_handle *)kv1,'\0');
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  pfVar18 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar13 = (fdb_iterator *)local_98[0]->key;
  sVar14 = strlen(bodybuf + 0xf8);
  fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pfVar13,sVar14,'\0');
  if (fVar11 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011323f;
  fVar11 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar20 = (fdb_kvs_handle *)iterator;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00113244;
  pfVar13 = (fdb_iterator *)iterator->_seqnum;
  pcVar50 = (char *)local_98[0]->key;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)iterator->handle);
  pcVar52 = (char *)local_98[0];
  if (iVar12 != 0) goto LAB_00113249;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar20)->tree_cursor_start;
  pcVar50 = (char *)local_98[0]->meta;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar20)->hbtrie_iterator);
  if (iVar12 != 0) goto LAB_00113254;
  pfVar13 = (fdb_iterator *)((fdb_iterator *)pfVar20)->tree_cursor_prev;
  pcVar50 = (char *)local_98[0]->body;
  pfVar18 = (fdb_kvs_handle *)pcVar50;
  iVar12 = bcmp(pfVar13,pcVar50,(size_t)((fdb_iterator *)pfVar20)->seqtree_iterator);
  uVar60 = SUB84(pfVar18,0);
  if (iVar12 != 0) goto LAB_0011325f;
  fdb_doc_free((fdb_doc *)pfVar20);
  iterator = (fdb_iterator *)0x0;
  fVar11 = fdb_iterator_close((fdb_iterator *)db);
  uVar58 = (uint)db;
  if (fVar11 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close(local_58);
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    fdb_close((fdb_file_handle *)kv1);
    lVar54 = 0;
    do {
      fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[lVar54]);
      lVar54 = lVar54 + 1;
    } while (lVar54 != 10);
    fdb_shutdown();
    memleak_end();
    pcVar50 = "%s PASSED\n";
    if (iterator_seek_test()::__test_pass != '\0') {
      pcVar50 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar50,"iterator seek test");
    return;
  }
  goto LAB_0011326a;
LAB_00114f8a:
  pcVar53 = (char *)(ulong)uVar58;
  pcVar50 = "key%06d";
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114f9a;
  iterator_complete_test();
LAB_00114f9a:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114faa;
  iterator_complete_test();
LAB_00114faa:
  pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
  pcVar49 = (char *)&pfVar19[-3].filename;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114fba;
  iterator_complete_test();
LAB_00114fba:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114fca;
  iterator_complete_test();
LAB_00114fca:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114fda;
  iterator_complete_test();
LAB_00114fda:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114fea;
  iterator_complete_test();
LAB_00114fea:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ffa;
  iterator_complete_test();
LAB_00114ffa:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x114fff;
  iterator_complete_test();
LAB_00114fff:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115004;
  iterator_complete_test();
LAB_00115004:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115009;
  iterator_complete_test();
LAB_00115009:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11500e;
  iterator_complete_test();
LAB_0011500e:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115013;
  iterator_complete_test();
LAB_00115013:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115018;
  iterator_complete_test();
LAB_00115018:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11501d;
  iterator_complete_test();
LAB_0011501d:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115022;
  iterator_complete_test();
LAB_00115022:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115027;
  iterator_complete_test();
LAB_00115027:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11502c;
  iterator_complete_test();
LAB_0011502c:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115031;
  iterator_complete_test();
LAB_00115031:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115036;
  iterator_complete_test();
LAB_00115036:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11503b;
  iterator_complete_test();
LAB_0011503b:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115040;
  iterator_complete_test();
LAB_00115040:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115050;
  iterator_complete_test();
LAB_00115050:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115060;
  iterator_complete_test();
LAB_00115060:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115070;
  iterator_complete_test();
LAB_00115070:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115080;
  iterator_complete_test();
  pfVar20 = (fdb_kvs_handle *)unaff_R13;
LAB_00115080:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115085;
  iterator_complete_test();
LAB_00115085:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11508a;
  iterator_complete_test();
  pfVar17 = pfVar20;
LAB_0011508a:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11508f;
  iterator_complete_test();
  pfVar20 = pfVar17;
LAB_0011508f:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115094;
  iterator_complete_test();
LAB_00115094:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x115099;
  iterator_complete_test();
  pfVar17 = pfVar18;
LAB_00115099:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11509e;
  iterator_complete_test();
LAB_0011509e:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150a8;
  iterator_complete_test();
  unaff_R13 = (char *)pfVar20;
  pfVar18 = pfVar17;
LAB_001150a8:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150ad;
  iterator_complete_test();
LAB_001150ad:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150b2;
  iterator_complete_test();
  goto LAB_001150b2;
LAB_00115614:
  pfVar19[-6].config.buffercache_size = 0x115621;
  iterator_extreme_key_test();
LAB_00115621:
  pfVar19[-6].config.buffercache_size = 0x11562e;
  iterator_extreme_key_test();
LAB_0011562e:
  pfVar18 = (fdb_kvs_handle *)&pfVar19[-6].config.seqtree_opt;
  pcVar50 = "0xff length %d";
  pcVar52 = (char *)&pfVar19[-6].config.compaction_cb_mask;
  pfVar19[-6].config.buffercache_size = 0x11563b;
  pfVar17 = (fdb_kvs_handle *)pcVar52;
  iterator_extreme_key_test();
  goto LAB_0011563b;
LAB_00113013:
  iterator_seek_test();
  pfVar18 = pfVar17;
  pfVar51 = pfVar13;
LAB_0011301e:
  pfVar13 = pfVar51;
  iterator_seek_test();
LAB_00113023:
  iterator_seek_test();
LAB_0011302e:
  iterator_seek_test();
LAB_00113039:
  iterator_seek_test();
  pfVar51 = pfVar13;
LAB_00113044:
  pfVar13 = pfVar51;
  iterator_seek_test();
LAB_00113049:
  iterator_seek_test();
LAB_00113054:
  iterator_seek_test();
LAB_0011305f:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113064;
  iterator_seek_test();
  pfVar17 = pfVar19;
LAB_00113064:
  *(undefined8 *)((long)pfVar17 + -8) = 0x113069;
  iterator_seek_test();
  puVar10 = (undefined1 *)pfVar17;
LAB_00113069:
  puVar24 = puVar10;
  *(undefined8 *)(puVar24 + -8) = 0x11306e;
  iterator_seek_test();
LAB_0011306e:
  pfVar22 = unaff_R12;
  pfVar17 = pfVar18;
  *(undefined8 *)(puVar24 + -8) = 0x113073;
  iterator_seek_test();
  puVar10 = puVar24;
LAB_00113073:
  puVar25 = puVar10;
  *(undefined8 *)(puVar25 + -8) = 0x11307e;
  iterator_seek_test();
LAB_0011307e:
  *(undefined8 *)(puVar25 + -8) = 0x113089;
  iterator_seek_test();
  puVar10 = puVar25;
LAB_00113089:
  puVar26 = puVar10;
  *(undefined8 *)(puVar26 + -8) = 0x113094;
  iterator_seek_test();
LAB_00113094:
  *(undefined8 *)(puVar26 + -8) = 0x113099;
  iterator_seek_test();
  puVar10 = puVar26;
LAB_00113099:
  pfVar55 = pfVar22;
  puVar27 = puVar10;
  pfVar18 = pfVar17;
  *(undefined8 *)(puVar27 + -8) = 0x11309e;
  iterator_seek_test();
LAB_0011309e:
  *(undefined8 *)(puVar27 + -8) = 0x1130a9;
  iterator_seek_test();
  puVar10 = puVar27;
LAB_001130a9:
  puVar28 = puVar10;
  *(undefined8 *)(puVar28 + -8) = 0x1130b4;
  iterator_seek_test();
LAB_001130b4:
  *(undefined8 *)(puVar28 + -8) = 0x1130bf;
  iterator_seek_test();
  puVar10 = puVar28;
LAB_001130bf:
  puVar29 = puVar10;
  *(undefined8 *)(puVar29 + -8) = 0x1130c4;
  iterator_seek_test();
LAB_001130c4:
  pfVar22 = pfVar55;
  pfVar17 = pfVar18;
  *(undefined8 *)(puVar29 + -8) = 0x1130c9;
  iterator_seek_test();
  puVar10 = puVar29;
LAB_001130c9:
  puVar30 = puVar10;
  *(undefined8 *)(puVar30 + -8) = 0x1130d4;
  iterator_seek_test();
LAB_001130d4:
  *(undefined8 *)(puVar30 + -8) = 0x1130df;
  iterator_seek_test();
  puVar10 = puVar30;
LAB_001130df:
  puVar31 = puVar10;
  *(undefined8 *)(puVar31 + -8) = 0x1130ea;
  iterator_seek_test();
LAB_001130ea:
  *(undefined8 *)(puVar31 + -8) = 0x1130ef;
  iterator_seek_test();
  puVar10 = puVar31;
LAB_001130ef:
  pfVar55 = pfVar22;
  puVar32 = puVar10;
  pfVar18 = pfVar17;
  *(undefined8 *)(puVar32 + -8) = 0x1130f4;
  iterator_seek_test();
LAB_001130f4:
  *(undefined8 *)(puVar32 + -8) = 0x1130ff;
  iterator_seek_test();
  puVar10 = puVar32;
LAB_001130ff:
  puVar33 = puVar10;
  *(undefined8 *)(puVar33 + -8) = 0x11310a;
  iterator_seek_test();
LAB_0011310a:
  *(undefined8 *)(puVar33 + -8) = 0x113115;
  iterator_seek_test();
  puVar10 = puVar33;
LAB_00113115:
  puVar34 = puVar10;
  *(undefined8 *)(puVar34 + -8) = 0x11311a;
  iterator_seek_test();
LAB_0011311a:
  unaff_R12 = pfVar55;
  pfVar17 = pfVar18;
  *(undefined8 *)(puVar34 + -8) = 0x11311f;
  iterator_seek_test();
  puVar10 = puVar34;
LAB_0011311f:
  puVar35 = puVar10;
  *(undefined8 *)(puVar35 + -8) = 0x11312a;
  iterator_seek_test();
LAB_0011312a:
  *(undefined8 *)(puVar35 + -8) = 0x113135;
  iterator_seek_test();
  puVar10 = puVar35;
LAB_00113135:
  puVar36 = puVar10;
  *(undefined8 *)(puVar36 + -8) = 0x113140;
  iterator_seek_test();
LAB_00113140:
  *(undefined8 *)(puVar36 + -8) = 0x113145;
  iterator_seek_test();
  puVar10 = puVar36;
LAB_00113145:
  puVar37 = puVar10;
  pfVar18 = pfVar17;
  *(undefined8 *)(puVar37 + -8) = 0x11314a;
  iterator_seek_test();
LAB_0011314a:
  *(undefined8 *)(puVar37 + -8) = 0x11314f;
  iterator_seek_test();
  puVar10 = puVar37;
LAB_0011314f:
  puVar38 = puVar10;
  *(undefined8 *)(puVar38 + -8) = 0x113154;
  iterator_seek_test();
LAB_00113154:
  *(undefined8 *)(puVar38 + -8) = 0x113159;
  iterator_seek_test();
  puVar10 = puVar38;
LAB_00113159:
  puVar39 = puVar10;
  *(undefined8 *)(puVar39 + -8) = 0x11315e;
  iterator_seek_test();
LAB_0011315e:
  pfVar19 = pfVar18;
  *(undefined8 *)(puVar39 + -8) = 0x113163;
  iterator_seek_test();
  puVar10 = puVar39;
LAB_00113163:
  puVar40 = puVar10;
  *(undefined8 *)(puVar40 + -8) = 0x11316e;
  iterator_seek_test();
LAB_0011316e:
  *(undefined8 *)(puVar40 + -8) = 0x113179;
  iterator_seek_test();
  puVar10 = puVar40;
LAB_00113179:
  puVar41 = puVar10;
  *(undefined8 *)(puVar41 + -8) = 0x113184;
  iterator_seek_test();
LAB_00113184:
  *(undefined8 *)(puVar41 + -8) = 0x113189;
  iterator_seek_test();
  puVar10 = puVar41;
LAB_00113189:
  puVar42 = puVar10;
  pfVar18 = pfVar19;
  *(undefined8 *)(puVar42 + -8) = 0x11318e;
  iterator_seek_test();
LAB_0011318e:
  *(undefined8 *)(puVar42 + -8) = 0x113199;
  iterator_seek_test();
  puVar10 = puVar42;
LAB_00113199:
  puVar43 = puVar10;
  *(undefined8 *)(puVar43 + -8) = 0x1131a4;
  iterator_seek_test();
LAB_001131a4:
  *(undefined8 *)(puVar43 + -8) = 0x1131af;
  iterator_seek_test();
  puVar10 = puVar43;
LAB_001131af:
  puVar44 = puVar10;
  *(undefined8 *)(puVar44 + -8) = 0x1131b4;
  iterator_seek_test();
LAB_001131b4:
  *(undefined8 *)(puVar44 + -8) = 0x1131b9;
  iterator_seek_test();
  puVar10 = puVar44;
LAB_001131b9:
  puVar45 = puVar10;
  *(undefined8 *)(puVar45 + -8) = 0x1131be;
  iterator_seek_test();
  local_98[2] = unaff_R12;
LAB_001131be:
  pcVar52 = (char *)local_98[2];
  pfVar17 = pfVar18;
  *(undefined8 *)(puVar45 + -8) = 0x1131c3;
  iterator_seek_test();
  puVar10 = puVar45;
LAB_001131c3:
  puVar46 = puVar10;
  *(undefined8 *)(puVar46 + -8) = 0x1131ce;
  iterator_seek_test();
LAB_001131ce:
  *(undefined8 *)(puVar46 + -8) = 0x1131d9;
  iterator_seek_test();
  puVar10 = puVar46;
LAB_001131d9:
  puVar47 = puVar10;
  *(undefined8 *)(puVar47 + -8) = 0x1131e4;
  iterator_seek_test();
LAB_001131e4:
  *(undefined8 *)(puVar47 + -8) = 0x1131e9;
  iterator_seek_test();
  puVar10 = puVar47;
LAB_001131e9:
  puVar48 = puVar10;
  pfVar19 = pfVar17;
  *(undefined8 *)(puVar48 + -8) = 0x1131ee;
  iterator_seek_test();
LAB_001131ee:
  *(undefined8 *)(puVar48 + -8) = 0x1131f9;
  iterator_seek_test();
  puVar10 = puVar48;
LAB_001131f9:
  pfVar20 = (fdb_kvs_handle *)puVar10;
  *(undefined8 *)((long)pfVar20 + -8) = 0x113204;
  iterator_seek_test();
LAB_00113204:
  *(undefined8 *)((long)pfVar20 + -8) = 0x11320f;
  iterator_seek_test();
LAB_0011320f:
  pfVar20[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113214;
  iterator_seek_test();
  pfVar17 = pfVar19;
  pfVar19 = pfVar20;
LAB_00113214:
  pfVar18 = pfVar17;
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113219;
  iterator_seek_test();
LAB_00113219:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113224;
  iterator_seek_test();
LAB_00113224:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11322f;
  iterator_seek_test();
LAB_0011322f:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11323a;
  iterator_seek_test();
LAB_0011323a:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11323f;
  iterator_seek_test();
LAB_0011323f:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113244;
  iterator_seek_test();
LAB_00113244:
  pfVar20 = pfVar18;
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113249;
  iterator_seek_test();
LAB_00113249:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113254;
  iterator_seek_test();
LAB_00113254:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11325f;
  iterator_seek_test();
LAB_0011325f:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11326a;
  pfVar51 = pfVar13;
  pfVar18 = (fdb_kvs_handle *)pcVar50;
  iterator_seek_test();
  uVar58 = (uint)pfVar18;
  uVar60 = SUB84(pfVar51,0);
LAB_0011326a:
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  pfVar19[-1].bub_ctx.handle = (fdb_kvs_handle *)&stack0xfffffffffffffff8;
  pfVar19[-1].bub_ctx.space_used = (uint64_t)pcVar50;
  pfVar19[-1].bub_ctx.num_entries = (uint64_t)pfVar13;
  pfVar19[-1].bub_ctx.entries = (list *)unaff_R13;
  *(char **)&pfVar19[-1].num_iterators = pcVar52;
  pfVar19[-1].node = (kvs_opened_node *)pfVar20;
  *(undefined4 *)(pfVar19[-3].config.encryption_key.bytes + 0x10) = uVar60;
  pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x113296;
  gettimeofday((timeval *)&pfVar19[-1].config.compaction_cb_mask,(__timezone_ptr_t)0x0);
  pfVar19[-3].config.num_bgflusher_threads = 0;
  pfVar19[-2].node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&pfVar19[-2].num_iterators = 0x726f746172657469;
  *(undefined8 *)&pfVar19[-2].field_0x1e7 = 0x2a747365745f72;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1132c4;
  system((char *)&pfVar19[-2].node);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1132c9;
  memleak_start();
  pcVar53 = (char *)&pfVar19[-1].config.max_writer_lock_prob;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1132d9;
  fdb_get_default_config();
  *(undefined4 *)((long)&pfVar19[-1].config.num_bgflusher_threads + 4) = 1;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1132ed;
  fdb_get_default_kvs_config();
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x113301;
  fVar11 = fdb_open((fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4),
                    "./iterator_test",(fdb_config *)pcVar53);
  if (fVar11 != FDB_RESULT_SUCCESS) {
LAB_001150b7:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150bc;
    iterator_complete_test();
LAB_001150bc:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150c1;
    iterator_complete_test();
LAB_001150c1:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150c6;
    iterator_complete_test();
LAB_001150c6:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150cb;
    iterator_complete_test();
LAB_001150cb:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150d0;
    iterator_complete_test();
LAB_001150d0:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150d5;
    iterator_complete_test();
LAB_001150d5:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150da;
    iterator_complete_test();
LAB_001150da:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150df;
    iterator_complete_test();
LAB_001150df:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150e4;
    iterator_complete_test();
LAB_001150e4:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150e9;
    iterator_complete_test();
LAB_001150e9:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150ee;
    iterator_complete_test();
LAB_001150ee:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150f3;
    iterator_complete_test();
LAB_001150f3:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150f8;
    iterator_complete_test();
LAB_001150f8:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150fd;
    iterator_complete_test();
LAB_001150fd:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115102;
    iterator_complete_test();
LAB_00115102:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115107;
    iterator_complete_test();
LAB_00115107:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11510c;
    iterator_complete_test();
LAB_0011510c:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115111;
    iterator_complete_test();
LAB_00115111:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115121;
    iterator_complete_test();
LAB_00115121:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115126;
    iterator_complete_test();
LAB_00115126:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11512b;
    iterator_complete_test();
LAB_0011512b:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115130;
    iterator_complete_test();
LAB_00115130:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115135;
    iterator_complete_test();
LAB_00115135:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115145;
    iterator_complete_test();
LAB_00115145:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11514a;
    iterator_complete_test();
LAB_0011514a:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11514f;
    iterator_complete_test();
LAB_0011514f:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115154;
    iterator_complete_test();
    pfVar20 = (fdb_kvs_handle *)unaff_R13;
LAB_00115154:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115159;
    iterator_complete_test();
LAB_00115159:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11515e;
    iterator_complete_test();
LAB_0011515e:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115163;
    iterator_complete_test();
LAB_00115163:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115168;
    iterator_complete_test();
LAB_00115168:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11516d;
    iterator_complete_test();
LAB_0011516d:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115172;
    iterator_complete_test();
LAB_00115172:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115177;
    iterator_complete_test();
    pfVar17 = pfVar18;
LAB_00115177:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11517c;
    iterator_complete_test();
LAB_0011517c:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115181;
    iterator_complete_test();
    pfVar18 = pfVar17;
LAB_00115181:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115186;
    iterator_complete_test();
LAB_00115186:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11518b;
    iterator_complete_test();
LAB_0011518b:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115190;
    iterator_complete_test();
LAB_00115190:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x115195;
    iterator_complete_test();
LAB_00115195:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11519a;
    iterator_complete_test();
LAB_0011519a:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11519f;
    iterator_complete_test();
LAB_0011519f:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1151a4;
    iterator_complete_test();
LAB_001151a4:
    pfVar19[-3].config.compaction_cb_ctx = iterator_extreme_key_test;
    iterator_complete_test();
    pfVar19[-3].config.compaction_cb_ctx = pcVar50;
    *(fdb_kvs_handle **)&pfVar19[-3].config.compaction_cb_mask = pfVar18;
    pfVar19[-3].config.compaction_cb = (fdb_compaction_callback)pfVar20;
    *(char **)&pfVar19[-3].config.num_wal_partitions = pcVar52;
    pfVar19[-3].config.prefetch_duration = (uint64_t)pcVar53;
    pfVar19[-6].config.buffercache_size = 0x1151c5;
    gettimeofday((timeval *)&pfVar19[-6].config.num_wal_partitions,(__timezone_ptr_t)0x0);
    pfVar19[-6].config.seqtree_opt = '\0';
    pfVar19[-6].config.durability_opt = '\0';
    *(undefined2 *)&pfVar19[-6].config.field_0x22 = 0;
    pfVar19[-6].config.flags = 0;
    pfVar19[-4].filename = (char *)0x202066722d206d72;
    pfVar19[-4].txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&pfVar19[-4].txn + 7) = 0x2a747365745f72;
    pfVar19[-6].config.buffercache_size = 0x1151f3;
    system((char *)&pfVar19[-4].filename);
    pfVar19[-6].config.buffercache_size = 0x1151f8;
    memleak_start();
    fconfig_00 = (atomic<unsigned_char> *)&pfVar19[-5].config.compaction_cb_mask;
    pfVar19[-6].config.buffercache_size = 0x115208;
    fdb_get_default_config();
    pfVar19[-6].config.buffercache_size = 0x115212;
    fdb_get_default_kvs_config();
    pfVar17 = (fdb_kvs_handle *)&pfVar19[-6].config.compaction_minimum_filesize;
    pfVar19[-6].config.buffercache_size = 0x115226;
    fVar11 = fdb_open((fdb_file_handle **)pfVar17,"./iterator_test",(fdb_config *)fconfig_00);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      pfVar17 = (fdb_kvs_handle *)pfVar19[-6].config.compaction_minimum_filesize;
      pfVar19[-6].config.buffercache_size = 0x115244;
      fVar11 = fdb_kvs_open((fdb_file_handle *)pfVar17,
                            (fdb_kvs_handle **)&pfVar19[-6].config.compaction_buf_maxsize,
                            (char *)0x0,
                            (fdb_kvs_config *)&pfVar19[-6].config.compactor_sleep_duration);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115640;
      fconfig_00 = &pfVar19[-6].handle_busy;
      pfVar19[-6].config.buffercache_size = 0x115266;
      memset(fconfig_00,0xff,0x100);
      uVar21 = 1;
      pcVar50 = "0xff length %d";
      pcVar52 = (char *)&pfVar19[-6].config.compaction_cb_mask;
      do {
        pfVar19[-6].config.buffercache_size = 0x115288;
        sprintf(pcVar52,"0xff length %d",uVar21 & 0xffffffff);
        pfVar20 = *(fdb_kvs_handle **)&pfVar19[-6].config.compaction_buf_maxsize;
        pfVar19[-6].config.buffercache_size = 0x115295;
        sVar14 = strlen(pcVar52);
        pfVar19[-6].config.buffercache_size = 0x1152aa;
        fdb_set_kv(pfVar20,fconfig_00,uVar21,pcVar52,sVar14 + 1);
        uVar21 = uVar21 + 1;
      } while (uVar21 != 0x1e);
      pfVar2 = (fdb_file_handle *)pfVar19[-6].config.compaction_minimum_filesize;
      pfVar19[-6].config.buffercache_size = 0x1152c2;
      fdb_commit(pfVar2,'\x01');
      pfVar19[-6].config.wal_threshold = 0;
      pfVar17 = (fdb_kvs_handle *)&pfVar19[-6].config.seqtree_opt;
      pfVar19[-6].config.buffercache_size = 0x1152e0;
      fVar11 = fdb_doc_create((fdb_doc **)pfVar17,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                              pfVar19[-6].config.wal_threshold);
      pfVar18 = (fdb_kvs_handle *)0x1e;
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115645;
      lVar54 = *(long *)&pfVar19[-6].config.seqtree_opt;
      *(uint16_t **)(lVar54 + 0x20) = &pfVar19[-4].config.num_wal_partitions;
      *(undefined8 *)(lVar54 + 0x38) = 0;
      *(fdb_txn ***)(lVar54 + 0x40) = &pfVar19[-5].txn;
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.compaction_buf_maxsize;
      *(undefined4 *)&pfVar19[-6].config.wal_threshold = 0;
      pfVar19[-6].config.buffercache_size = 0x11532d;
      fVar11 = fdb_iterator_init(pfVar17,(fdb_iterator **)
                                         &pfVar19[-6].config.wal_flush_before_commit,(void *)0x0,0,
                                 (void *)0x0,0,(fdb_iterator_opt_t)pfVar19[-6].config.wal_threshold)
      ;
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011564a;
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x11533f;
      fVar11 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011564f;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
        pfVar19[-6].config.buffercache_size = 0x11536a;
        fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-6].config.seqtree_opt);
        if (fVar11 != FDB_RESULT_SUCCESS) break;
        pfVar19[-6].config.buffercache_size = 0x11537d;
        sprintf((char *)&pfVar19[-6].config.compaction_cb_mask,"0xff length %d",fconfig_00);
        sVar14 = *(size_t *)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x10);
        pfVar20 = *(fdb_kvs_handle **)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x40);
        pfVar19[-6].config.buffercache_size = 0x115395;
        iVar12 = bcmp(pfVar20,&pfVar19[-6].config.compaction_cb_mask,sVar14);
        if (iVar12 != 0) {
          pfVar19[-6].config.buffercache_size = 0x115614;
          iterator_extreme_key_test();
          goto LAB_00115614;
        }
        pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
        pfVar19[-6].config.buffercache_size = 0x1153a7;
        fVar11 = fdb_iterator_prev(pfVar13);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar11 == FDB_RESULT_SUCCESS);
      pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x1153c9;
      fVar11 = fdb_iterator_seek(pfVar13,&pfVar19[-6].handle_busy,8,'\x01');
      if (fVar11 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
          pfVar19[-6].config.buffercache_size = 0x1153f0;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-6].config.seqtree_opt);
          if (fVar11 != FDB_RESULT_SUCCESS) break;
          pfVar19[-6].config.buffercache_size = 0x115403;
          sprintf((char *)&pfVar19[-6].config.compaction_cb_mask,"0xff length %d",fconfig_00);
          sVar14 = *(size_t *)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x10);
          pfVar20 = *(fdb_kvs_handle **)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x40);
          pfVar19[-6].config.buffercache_size = 0x11541b;
          iVar12 = bcmp(pfVar20,&pfVar19[-6].config.compaction_cb_mask,sVar14);
          if (iVar12 != 0) goto LAB_00115621;
          pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
          pfVar19[-6].config.buffercache_size = 0x11542d;
          fVar11 = fdb_iterator_prev(pfVar13);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
        } while (fVar11 == FDB_RESULT_SUCCESS);
      }
      pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x11544f;
      fVar11 = fdb_iterator_seek(pfVar13,&pfVar19[-6].handle_busy,8,'\x01');
      if (fVar11 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
          pfVar19[-6].config.buffercache_size = 0x115476;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-6].config.seqtree_opt);
          if (fVar11 != FDB_RESULT_SUCCESS) break;
          pfVar19[-6].config.buffercache_size = 0x115489;
          sprintf((char *)&pfVar19[-6].config.compaction_cb_mask,"0xff length %d",fconfig_00);
          sVar14 = *(size_t *)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x10);
          pfVar20 = *(fdb_kvs_handle **)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x40);
          pfVar19[-6].config.buffercache_size = 0x1154a1;
          iVar12 = bcmp(pfVar20,&pfVar19[-6].config.compaction_cb_mask,sVar14);
          if (iVar12 != 0) goto LAB_0011562e;
          pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
          pfVar19[-6].config.buffercache_size = 0x1154b3;
          fVar11 = fdb_iterator_next(pfVar13);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 + 1);
        } while (fVar11 == FDB_RESULT_SUCCESS);
      }
      pfVar18 = (fdb_kvs_handle *)&pfVar19[-6].config.seqtree_opt;
      pcVar52 = (char *)&pfVar19[-6].config.compaction_cb_mask;
      pcVar50 = "0xff length %d";
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x1154c3;
      fVar11 = fdb_iterator_close((fdb_iterator *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115654;
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.compaction_buf_maxsize;
      *(undefined4 *)&pfVar19[-6].config.wal_threshold = 0;
      pfVar19[-6].config.buffercache_size = 0x1154f3;
      fVar11 = fdb_iterator_init(pfVar17,(fdb_iterator **)
                                         &pfVar19[-6].config.wal_flush_before_commit,(void *)0x0,0,
                                 &pfVar19[-6].handle_busy,0x100,
                                 (fdb_iterator_opt_t)pfVar19[-6].config.wal_threshold);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115659;
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x115505;
      fVar11 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011565e;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      pfVar18 = (fdb_kvs_handle *)&pfVar19[-6].config.seqtree_opt;
      pcVar50 = "0xff length %d";
      pcVar52 = (char *)&pfVar19[-6].config.compaction_cb_mask;
      do {
        pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
        pfVar19[-6].config.buffercache_size = 0x115530;
        fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)pfVar18);
        if (fVar11 != FDB_RESULT_SUCCESS) break;
        pfVar19[-6].config.buffercache_size = 0x115543;
        sprintf(pcVar52,"0xff length %d",fconfig_00);
        sVar14 = *(size_t *)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x10);
        pfVar20 = *(fdb_kvs_handle **)(*(long *)&pfVar19[-6].config.seqtree_opt + 0x40);
        pfVar19[-6].config.buffercache_size = 0x11555b;
        iVar12 = bcmp(pfVar20,pcVar52,sVar14);
        if (iVar12 != 0) goto LAB_00115614;
        pfVar13 = *(fdb_iterator **)&pfVar19[-6].config.wal_flush_before_commit;
        pfVar19[-6].config.buffercache_size = 0x11556d;
        fVar11 = fdb_iterator_prev(pfVar13);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar11 == FDB_RESULT_SUCCESS);
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.wal_flush_before_commit;
      pfVar19[-6].config.buffercache_size = 0x11557d;
      fVar11 = fdb_iterator_close((fdb_iterator *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115663;
      pfVar17 = (fdb_kvs_handle *)pfVar19[-6].config.compaction_minimum_filesize;
      pfVar19[-6].config.buffercache_size = 0x11558f;
      fVar11 = fdb_close((fdb_file_handle *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115668;
      pfVar17 = *(fdb_kvs_handle **)&pfVar19[-6].config.seqtree_opt;
      pfVar17->op_stats = (kvs_ops_stat *)0x0;
      (pfVar17->field_6).seqtree = (btree *)0x0;
      pfVar19[-6].config.buffercache_size = 0x1155ab;
      fVar11 = fdb_doc_free((fdb_doc *)pfVar17);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011566d;
      pfVar19[-6].config.buffercache_size = 0x1155b8;
      fVar11 = fdb_shutdown();
      if (fVar11 == FDB_RESULT_SUCCESS) {
        pfVar19[-6].config.buffercache_size = 0x1155c5;
        memleak_end();
        pcVar50 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar50 = "%s FAILED\n";
        }
        pfVar19[-6].config.buffercache_size = 0x1155f6;
        fprintf(_stderr,pcVar50,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011563b:
      pfVar19[-6].config.buffercache_size = 0x115640;
      iterator_extreme_key_test();
LAB_00115640:
      pfVar19[-6].config.buffercache_size = 0x115645;
      iterator_extreme_key_test();
LAB_00115645:
      pfVar19[-6].config.buffercache_size = 0x11564a;
      iterator_extreme_key_test();
LAB_0011564a:
      pfVar19[-6].config.buffercache_size = 0x11564f;
      iterator_extreme_key_test();
LAB_0011564f:
      pfVar19[-6].config.buffercache_size = 0x115654;
      iterator_extreme_key_test();
LAB_00115654:
      pfVar19[-6].config.buffercache_size = 0x115659;
      iterator_extreme_key_test();
LAB_00115659:
      pfVar19[-6].config.buffercache_size = 0x11565e;
      iterator_extreme_key_test();
LAB_0011565e:
      pfVar19[-6].config.buffercache_size = 0x115663;
      iterator_extreme_key_test();
LAB_00115663:
      pfVar19[-6].config.buffercache_size = 0x115668;
      iterator_extreme_key_test();
LAB_00115668:
      pfVar19[-6].config.buffercache_size = 0x11566d;
      iterator_extreme_key_test();
LAB_0011566d:
      pfVar19[-6].config.buffercache_size = 0x115672;
      iterator_extreme_key_test();
    }
    pfVar19[-6].config.buffercache_size = (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    pfVar19[-6].config.buffercache_size = (uint64_t)pcVar49;
    *(char **)&pfVar19[-6].config = pcVar50;
    pfVar19[-6].fileops = (filemgr_ops *)pfVar18;
    pfVar19[-6].btreeblkops = (btree_blk_ops *)pfVar20;
    pfVar19[-6].bhandle = (btreeblk_handle *)pcVar52;
    pfVar19[-6].dhandle = (docio_handle *)fconfig_00;
    sVar14 = (ulong)pfVar17 & 0xffffffff;
    pvVar57 = (void *)0x0;
    pfVar19[-9].node = (kvs_opened_node *)0x11569c;
    gettimeofday((timeval *)&pfVar19[-8].bhandle,(__timezone_ptr_t)0x0);
    pfVar19[-9].node = (kvs_opened_node *)0x1156a1;
    memleak_start();
    pfVar19[-9].bub_ctx.num_entries = 0;
    pfVar19[-9].node = (kvs_opened_node *)0x1156b2;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar22 = (fdb_doc *)&pfVar19[-7].config.num_blocks_readahead;
    pfVar19[-9].node = (kvs_opened_node *)0x1156c2;
    fdb_get_default_config();
    pfVar19[-9].node = (kvs_opened_node *)0x1156cc;
    fdb_get_default_kvs_config();
    pfVar19[-7].log_callback.callback = (fdb_log_callback)0x0;
    pfVar19[-7].log_callback.callback_ex = (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&pfVar19[-7].cur_header_revnum.super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&pfVar19[-7].rollback_revnum + 7) = 0;
    pfVar19[-9].node = (kvs_opened_node *)0x1156f7;
    fVar11 = fdb_open((fdb_file_handle **)(pfVar19 + -8),"./iterator_test1",(fdb_config *)pfVar22);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&pfVar19[-8].kvs_config.custom_cmp + 4) = (int)pfVar17;
      pfVar18 = *(fdb_kvs_handle **)&pfVar19[-8].kvs_config;
      pfVar19[-9].node = (kvs_opened_node *)0x115717;
      fVar11 = fdb_kvs_open_default
                         ((fdb_file_handle *)pfVar18,&pfVar19[-9].bub_ctx.handle,
                          (fdb_kvs_config *)&pfVar19[-8].kvs_config.custom_cmp_param);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b0c;
      pfVar20 = (fdb_kvs_handle *)0x0;
      uVar21 = 0;
      do {
        pfVar19[-9].node = (kvs_opened_node *)0x115742;
        sprintf((char *)&pfVar19[-7].btreeblkops,"%c2",(ulong)((int)uVar21 + 0x61));
        pfVar19[-9].node = (kvs_opened_node *)0x11575b;
        sprintf((char *)&pfVar19[-8].log_callback,"meta%d",uVar21 & 0xffffffff);
        pfVar19[-9].node = (kvs_opened_node *)0x115774;
        sprintf((char *)&pfVar19[-8].fileops,"body%d",uVar21 & 0xffffffff);
        pcVar52 = (char *)((long)pfVar20 + (long)&pfVar19[-8].fhandle);
        pfVar19[-9].node = (kvs_opened_node *)0x115784;
        sVar14 = strlen((char *)&pfVar19[-7].btreeblkops);
        pfVar22 = (fdb_doc *)&pfVar19[-8].log_callback;
        pfVar19[-9].node = (kvs_opened_node *)0x115797;
        pcVar50 = (char *)strlen((char *)pfVar22);
        pfVar19[-9].node = (kvs_opened_node *)0x1157a7;
        sVar15 = strlen((char *)&pfVar19[-8].fileops);
        *(size_t *)&pfVar19[-9].num_iterators = sVar15;
        pfVar19[-9].node = (kvs_opened_node *)0x1157cc;
        fdb_doc_create((fdb_doc **)pcVar52,&pfVar19[-7].btreeblkops,sVar14,pfVar22,(size_t)pcVar50,
                       &pfVar19[-8].fileops,*(size_t *)&pfVar19[-9].num_iterators);
        pfVar18 = pfVar19[-9].bub_ctx.handle;
        pfVar55 = *(fdb_doc **)((long)pfVar19 + uVar21 * 8 + -0x1018);
        pfVar19[-9].node = (kvs_opened_node *)0x1157db;
        fdb_set(pfVar18,pfVar55);
        uVar21 = uVar21 + 1;
        pfVar20 = (fdb_kvs_handle *)((long)pfVar20 + 8);
      } while (uVar21 != 5);
      pfVar18 = *(fdb_kvs_handle **)&pfVar19[-8].kvs_config;
      opt = *(fdb_commit_opt_t *)((long)&pfVar19[-8].kvs_config.custom_cmp + 4);
      pfVar19[-9].node = (kvs_opened_node *)0x1157fb;
      fdb_commit((fdb_file_handle *)pfVar18,opt);
      pfVar18 = pfVar19[-9].bub_ctx.handle;
      pfVar19[-9].node = (kvs_opened_node *)0x115811;
      fVar11 = fdb_snapshot_open(pfVar18,(fdb_kvs_handle **)&pfVar19[-9].bub_ctx.space_used,
                                 0xffffffffffffffff);
      pvVar57 = (void *)0x5;
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b11;
      pfVar18 = pfVar19[-9].bub_ctx.handle;
      pfVar19[-9].node = (kvs_opened_node *)0x115831;
      fVar11 = fdb_set_log_callback(pfVar18,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b16;
      pfVar18 = (fdb_kvs_handle *)pfVar19[-9].bub_ctx.space_used;
      pfVar19[-9].num_iterators = 0xe;
      pfVar22 = (fdb_doc *)&pfVar19[-9].bub_ctx;
      pfVar19[-9].node = (kvs_opened_node *)0x11586b;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar22,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)pfVar19[-9].num_iterators);
      pfVar13 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar22)->entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115884;
      fVar11 = fdb_iterator_seek(pfVar13,"c1",2,'\x01');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b1b;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x1158a5;
      fVar11 = fdb_iterator_seek(pfVar13,"c3",2,'\0');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b20;
      pfVar22 = (fdb_doc *)&pfVar19[-9].bub_ctx;
      pfVar13 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar22)->entries;
      pfVar19[-9].node = (kvs_opened_node *)0x1158bb;
      fdb_iterator_close(pfVar13);
      pfVar18 = (fdb_kvs_handle *)pfVar19[-9].bub_ctx.space_used;
      pfVar19[-9].num_iterators = 0xe;
      pfVar19[-9].node = (kvs_opened_node *)0x1158e8;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar22,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)pfVar19[-9].num_iterators);
      pfVar13 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar22)->entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115901;
      fVar11 = fdb_iterator_seek(pfVar13,"c1",2,'\x01');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b25;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115922;
      fVar11 = fdb_iterator_seek(pfVar13,"c3",2,'\0');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b2a;
      pfVar22 = (fdb_doc *)&pfVar19[-9].bub_ctx;
      pfVar13 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar22)->entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115938;
      fdb_iterator_close(pfVar13);
      pfVar18 = (fdb_kvs_handle *)pfVar19[-9].bub_ctx.space_used;
      pfVar19[-9].num_iterators = 0xe;
      pfVar19[-9].node = (kvs_opened_node *)0x115965;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar22,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)pfVar19[-9].num_iterators);
      pfVar13 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar22)->entries;
      pfVar19[-9].node = (kvs_opened_node *)0x11596d;
      fVar11 = fdb_iterator_seek_to_max(pfVar13);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b2f;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115984;
      fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-9].bub_ctx.num_entries);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b34;
      pfVar22 = (fdb_doc *)pfVar19[-9].bub_ctx.num_entries;
      sVar15 = pfVar22->keylen;
      pvVar57 = pfVar22->key;
      pfVar19[-9].node = (kvs_opened_node *)0x1159a7;
      iVar12 = bcmp(pvVar57,"d2",sVar15);
      if (iVar12 != 0) goto LAB_00115b39;
      pfVar19[-9].node = (kvs_opened_node *)0x1159b7;
      fdb_doc_free(pfVar22);
      pfVar19[-9].bub_ctx.num_entries = 0;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x1159d8;
      fVar11 = fdb_iterator_seek(pfVar13,"e2",2,'\0');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b41;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x1159eb;
      fVar11 = fdb_iterator_seek_to_min(pfVar13);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b46;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115a02;
      fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-9].bub_ctx.num_entries);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115b4b;
      pfVar22 = (fdb_doc *)pfVar19[-9].bub_ctx.num_entries;
      sVar15 = pfVar22->keylen;
      pvVar57 = pfVar22->key;
      pfVar19[-9].node = (kvs_opened_node *)0x115a25;
      iVar12 = bcmp(pvVar57,"c2",sVar15);
      if (iVar12 != 0) goto LAB_00115b50;
      pfVar19[-9].node = (kvs_opened_node *)0x115a35;
      fdb_doc_free(pfVar22);
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115a50;
      fVar11 = fdb_iterator_seek(pfVar13,"b0",2,'\x01');
      if (fVar11 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b58;
      pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
      pfVar19[-9].node = (kvs_opened_node *)0x115a74;
      fVar11 = fdb_iterator_seek(pfVar13,"b0",2,'\x01');
      if (fVar11 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar13 = (fdb_iterator *)pfVar19[-9].bub_ctx.entries;
        pfVar19[-9].node = (kvs_opened_node *)0x115a87;
        fdb_iterator_close(pfVar13);
        pfVar18 = pfVar19[-9].bub_ctx.handle;
        pfVar19[-9].node = (kvs_opened_node *)0x115a91;
        fdb_kvs_close(pfVar18);
        pfVar18 = (fdb_kvs_handle *)pfVar19[-9].bub_ctx.space_used;
        pfVar19[-9].node = (kvs_opened_node *)0x115a9b;
        fdb_kvs_close(pfVar18);
        pfVar18 = *(fdb_kvs_handle **)&pfVar19[-8].kvs_config;
        pfVar19[-9].node = (kvs_opened_node *)0x115aa5;
        fdb_close((fdb_file_handle *)pfVar18);
        lVar54 = 0;
        do {
          pfVar22 = *(fdb_doc **)((long)pfVar19 + lVar54 * 8 + -0x1018);
          pfVar19[-9].node = (kvs_opened_node *)0x115ab1;
          fdb_doc_free(pfVar22);
          lVar54 = lVar54 + 1;
        } while (lVar54 != 5);
        pfVar19[-9].node = (kvs_opened_node *)0x115abf;
        fdb_shutdown();
        pfVar19[-9].node = (kvs_opened_node *)0x115ac4;
        memleak_end();
        pcVar50 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar50 = "%s FAILED\n";
        }
        pfVar19[-9].node = (kvs_opened_node *)0x115af5;
        fprintf(_stderr,pcVar50,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      pfVar19[-9].node = (kvs_opened_node *)0x115b0c;
      iterator_inmem_snapshot_seek_test();
LAB_00115b0c:
      pfVar19[-9].node = (kvs_opened_node *)0x115b11;
      iterator_inmem_snapshot_seek_test();
LAB_00115b11:
      pfVar19[-9].node = (kvs_opened_node *)0x115b16;
      iterator_inmem_snapshot_seek_test();
LAB_00115b16:
      pfVar19[-9].node = (kvs_opened_node *)0x115b1b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b1b:
      pfVar19[-9].node = (kvs_opened_node *)0x115b20;
      iterator_inmem_snapshot_seek_test();
LAB_00115b20:
      pfVar19[-9].node = (kvs_opened_node *)0x115b25;
      iterator_inmem_snapshot_seek_test();
LAB_00115b25:
      pfVar19[-9].node = (kvs_opened_node *)0x115b2a;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2a:
      pfVar19[-9].node = (kvs_opened_node *)0x115b2f;
      iterator_inmem_snapshot_seek_test();
LAB_00115b2f:
      pfVar19[-9].node = (kvs_opened_node *)0x115b34;
      iterator_inmem_snapshot_seek_test();
LAB_00115b34:
      pfVar19[-9].node = (kvs_opened_node *)0x115b39;
      iterator_inmem_snapshot_seek_test();
LAB_00115b39:
      pfVar19[-9].node = (kvs_opened_node *)0x115b41;
      iterator_inmem_snapshot_seek_test();
LAB_00115b41:
      pfVar19[-9].node = (kvs_opened_node *)0x115b46;
      iterator_inmem_snapshot_seek_test();
LAB_00115b46:
      pfVar19[-9].node = (kvs_opened_node *)0x115b4b;
      iterator_inmem_snapshot_seek_test();
LAB_00115b4b:
      pfVar19[-9].node = (kvs_opened_node *)0x115b50;
      iterator_inmem_snapshot_seek_test();
LAB_00115b50:
      pfVar19[-9].node = (kvs_opened_node *)0x115b58;
      iterator_inmem_snapshot_seek_test();
LAB_00115b58:
      pfVar19[-9].node = (kvs_opened_node *)0x115b5d;
      iterator_inmem_snapshot_seek_test();
    }
    pfVar19[-9].node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    pfVar19[-9].node = (kvs_opened_node *)sVar14;
    *(char **)&pfVar19[-9].handle_busy = pcVar50;
    pfVar19[-9].txn = (fdb_txn *)pvVar57;
    pfVar19[-9].filename = (char *)pfVar20;
    pfVar19[-9].max_seqnum = (fdb_seqnum_t)pcVar52;
    pfVar19[-9].seqnum = (fdb_seqnum_t)pfVar22;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115b82;
    gettimeofday((timeval *)&pfVar19[-10].config.seqtree_opt,(__timezone_ptr_t)0x0);
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115b87;
    memleak_start();
    pfVar19[-10].op_stats = (kvs_ops_stat *)0x0;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115b9c;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115bac;
    fdb_get_default_config();
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115bbc;
    fdb_get_default_kvs_config();
    pfVar19[-10].config.compaction_cb = (fdb_compaction_callback)0x400;
    *(undefined4 *)((long)&pfVar19[-10].config.compaction_cb_ctx + 4) = 1;
    *(undefined1 *)((long)&pfVar19[-10].config.max_writer_lock_prob + 7) = 0;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115be6;
    fdb_open((fdb_file_handle **)&pfVar19[-10].staletree,"./iterator_test",
             (fdb_config *)&pfVar19[-10].config.prefetch_duration);
    pbVar5 = pfVar19[-10].staletree;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115bfd;
    fdb_kvs_open((fdb_file_handle *)pbVar5,(fdb_kvs_handle **)&pfVar19[-10].fhandle,"all_docs",
                 (fdb_kvs_config *)&pfVar19[-10].config.compaction_minimum_filesize);
    __s = &pfVar19[-9].config.compactor_sleep_duration;
    __s_00 = &pfVar19[-10].seqnum;
    lVar54 = 0;
    uVar21 = 0;
    do {
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c27;
      sprintf((char *)__s,"key%d",uVar21 & 0xffffffff);
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c3b;
      sprintf((char *)__s_00,"body%d",uVar21 & 0xffffffff);
      lVar9 = lVar54 + -0x1410;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c4b;
      sVar14 = strlen((char *)__s);
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c56;
      sVar15 = strlen((char *)__s_00);
      pfVar19[-10].kvs_config.custom_cmp_param = (void *)sVar15;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c70;
      fdb_doc_create((fdb_doc **)((long)pfVar19 + lVar9),__s,sVar14,(void *)0x0,0,__s_00,
                     (size_t)pfVar19[-10].kvs_config.custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
      pfVar22 = *(fdb_doc **)((long)pfVar19 + uVar21 * 8 + -0x1410);
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c7f;
      fdb_set(pfVar18,pfVar22);
      uVar21 = uVar21 + 1;
      lVar54 = lVar54 + 8;
    } while (uVar21 != 10);
    doc = (list *)0x0;
    do {
      pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
      psVar6 = *(size_t **)((long)pfVar19 + (long)doc * 8 + -0x1410);
      keylen = *psVar6;
      pvVar57 = (void *)psVar6[4];
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115ca4;
      fVar11 = fdb_del_kv(pfVar18,pvVar57,keylen);
      if (fVar11 != FDB_RESULT_SUCCESS) {
        pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e0c;
        iterator_no_deletes_test();
        goto LAB_00115e0c;
      }
      doc = (list *)((long)&doc->head + 1);
    } while (doc != (list *)0xa);
    pbVar5 = pfVar19[-10].staletree;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115cc1;
    fdb_commit((fdb_file_handle *)pbVar5,'\0');
    pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
    pfVar22 = (fdb_doc *)pfVar19[-10].dhandle;
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115cd0;
    fVar11 = fdb_set(pfVar18,pfVar22);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      keylen_00 = (pfVar19[-10].dhandle)->file;
      pvVar57 = (void *)(pfVar19[-10].dhandle)->lastBmpRevnum;
      pfVar19[-10].kvs_config.custom_cmp_param = (void *)0x0;
      doc = (list *)&pfVar19[-10].op_stats;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d01;
      fdb_doc_create((fdb_doc **)doc,pvVar57,(size_t)keylen_00,(void *)0x0,0,(void *)0x0,
                     (size_t)pfVar19[-10].kvs_config.custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
      pfVar22 = *(fdb_doc **)doc;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d0e;
      fVar11 = fdb_get(pfVar18,pfVar22);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115e11;
      if ((char)pfVar19[-10].op_stats[1].num_commits.super___atomic_base<unsigned_long>._M_i != '\0'
         ) {
        pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d2b;
        iterator_no_deletes_test();
      }
      pfVar22 = (fdb_doc *)pfVar19[-10].op_stats;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d35;
      fdb_doc_free(pfVar22);
      pfVar19[-10].op_stats = (kvs_ops_stat *)0x0;
      pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
      *(undefined4 *)&pfVar19[-10].kvs_config.custom_cmp_param = 2;
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d5e;
      fVar11 = fdb_iterator_init(pfVar18,(fdb_iterator **)&pfVar19[-10].trie,(void *)0x0,0,
                                 (void *)0x0,0,
                                 *(fdb_iterator_opt_t *)&pfVar19[-10].kvs_config.custom_cmp_param);
      if (fVar11 == FDB_RESULT_SUCCESS) {
        pfVar13 = (fdb_iterator *)pfVar19[-10].trie;
        pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d75;
        fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-10].op_stats);
        if (fVar11 == FDB_RESULT_SUCCESS) {
          pfVar22 = (fdb_doc *)pfVar19[-10].op_stats;
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d87;
          fdb_doc_free(pfVar22);
          pfVar13 = (fdb_iterator *)pfVar19[-10].trie;
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d91;
          fdb_iterator_close(pfVar13);
          lVar54 = 0;
          do {
            pfVar22 = *(fdb_doc **)((long)pfVar19 + lVar54 * 8 + -0x1410);
            pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d9d;
            fdb_doc_free(pfVar22);
            lVar54 = lVar54 + 1;
          } while (lVar54 != 10);
          pfVar18 = (fdb_kvs_handle *)pfVar19[-10].fhandle;
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115db0;
          fdb_kvs_close(pfVar18);
          pbVar5 = pfVar19[-10].staletree;
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115dba;
          fdb_close((fdb_file_handle *)pbVar5);
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115dbf;
          fdb_shutdown();
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115dc4;
          memleak_end();
          pcVar50 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar50 = "%s FAILED\n";
          }
          pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115df5;
          fprintf(_stderr,pcVar50,"iterator no deletes test");
          return;
        }
        goto LAB_00115e1b;
      }
    }
    else {
LAB_00115e0c:
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e11;
      iterator_no_deletes_test();
LAB_00115e11:
      pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e16;
      iterator_no_deletes_test();
    }
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e1b;
    iterator_no_deletes_test();
LAB_00115e1b:
    pfVar19[-10].kvs_config.custom_cmp = iterator_set_del_docs_test;
    iterator_no_deletes_test();
    pfVar19[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)((long)pfVar19 + lVar9);
    *(long *)&pfVar19[-10].kvs_config = lVar54;
    pfVar19[-0xb].bub_ctx.handle = (fdb_kvs_handle *)__s;
    pfVar19[-0xb].bub_ctx.space_used = 10;
    pfVar19[-0xb].bub_ctx.num_entries = (uint64_t)__s_00;
    pfVar19[-0xb].bub_ctx.entries = doc;
    pfVar19[-0xe].trie = (hbtrie *)0x115e3d;
    gettimeofday((timeval *)&pfVar19[-0xe].config.multi_kv_instances,(__timezone_ptr_t)0x0);
    pfVar19[-0xe].trie = (hbtrie *)0x115e42;
    memleak_start();
    pfVar19[-0xe].trie = (hbtrie *)0x115e52;
    fdb_get_default_config();
    pfVar19[-0xe].trie = (hbtrie *)0x115e62;
    fdb_get_default_kvs_config();
    pfVar19[-0xe].trie = (hbtrie *)0x115e6e;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar19[-0xc].config.encryption_key.algorithm = 0x400;
    pfVar19[-0xc].config.encryption_key.bytes[0] = '\0';
    pfVar19[-0xc].config.encryption_key.bytes[1] = '\0';
    pfVar19[-0xc].config.encryption_key.bytes[2] = '\0';
    pfVar19[-0xc].config.encryption_key.bytes[3] = '\0';
    pfVar8 = &pfVar19[-0xc].config;
    (pfVar8->encryption_key).bytes[0x10] = '\x01';
    (pfVar8->encryption_key).bytes[0x11] = '\0';
    (pfVar8->encryption_key).bytes[0x12] = '\0';
    (pfVar8->encryption_key).bytes[0x13] = '\0';
    pfVar19[-0xc].config.encryption_key.bytes[0x1b] = '\n';
    pfVar8 = &pfVar19[-0xc].config;
    (pfVar8->encryption_key).bytes[8] = '\x01';
    (pfVar8->encryption_key).bytes[9] = '\0';
    (pfVar8->encryption_key).bytes[10] = '\0';
    (pfVar8->encryption_key).bytes[0xb] = '\0';
    pfVar19[-0xe].trie = (hbtrie *)0x115e9c;
    fdb_open((fdb_file_handle **)&pfVar19[-0xe].fileops,"./iterator_test1",
             (fdb_config *)&pfVar19[-0xc].config.enable_background_compactor);
    pfVar19[-0xe].trie = (hbtrie *)0x115eb3;
    fdb_kvs_open((fdb_file_handle *)pfVar19[-0xe].fileops,(fdb_kvs_handle **)&pfVar19[-0xe].file,
                 "kv1",(fdb_kvs_config *)&pfVar19[-0xe].config.num_wal_partitions);
    psVar6 = &pfVar19[-0xb].config.max_writer_lock_prob;
    pfVar19[-0xe].bhandle = (btreeblk_handle *)0x0;
    iVar12 = 0;
    do {
      *(int *)((long)&pfVar19[-0xe].dhandle + 4) = iVar12;
      lVar54 = 0;
      uVar21 = 0;
      do {
        uVar58 = *(uint *)((long)&pfVar19[-0xe].dhandle + 4);
        pfVar19[-0xe].trie = (hbtrie *)0x115ef3;
        sprintf((char *)psVar6,"key%02d%03d",(ulong)uVar58,uVar21 & 0xffffffff);
        __s_01 = &pfVar19[-0xc].bub_ctx;
        pfVar19[-0xe].trie = (hbtrie *)0x115f12;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar58,uVar21 & 0xffffffff);
        pfVar19[-0xe].trie = (hbtrie *)0x115f29;
        sprintf((char *)&pfVar19[-0xe].config.compaction_cb_ctx,"body%02d%03d",(ulong)uVar58,
                uVar21 & 0xffffffff);
        *(undefined1 **)&pfVar19[-0xe].config = (undefined1 *)((long)pfVar19 + lVar54 + -0x1a98);
        pfVar19[-0xe].trie = (hbtrie *)0x115f40;
        sVar14 = strlen((char *)psVar6);
        pfVar19[-0xe].trie = (hbtrie *)0x115f4b;
        sVar15 = strlen((char *)__s_01);
        pfVar19[-0xe].trie = (hbtrie *)0x115f5b;
        sVar16 = strlen((char *)&pfVar19[-0xe].config.compaction_cb_ctx);
        pfVar19[-0xe].staletree = (btree *)sVar16;
        pfVar19[-0xe].trie = (hbtrie *)0x115f80;
        fdb_doc_create(*(fdb_doc ***)&pfVar19[-0xe].config,psVar6,sVar14,__s_01,sVar15,
                       &pfVar19[-0xe].config.compaction_cb_ctx,(size_t)pfVar19[-0xe].staletree);
        pfVar22 = *(fdb_doc **)((long)pfVar19 + uVar21 * 8 + -0x1a98);
        pfVar19[-0xe].trie = (hbtrie *)0x115f92;
        fdb_set((fdb_kvs_handle *)pfVar19[-0xe].file,pfVar22);
        uVar21 = uVar21 + 1;
        lVar54 = lVar54 + 8;
      } while (uVar21 != 100);
      pfVar19[-0xe].trie = (hbtrie *)0x115fb2;
      fdb_commit((fdb_file_handle *)pfVar19[-0xe].fileops,'\x01');
      lVar54 = 0;
      do {
        pfVar22 = *(fdb_doc **)((long)pfVar19 + lVar54 * 8 + -0x19d0);
        pfVar19[-0xe].trie = (hbtrie *)0x115fc6;
        fdb_del((fdb_kvs_handle *)pfVar19[-0xe].file,pfVar22);
        lVar54 = lVar54 + 1;
      } while (lVar54 != 0x19);
      pbVar23 = (btreeblk_handle *)((long)&((pfVar19[-0xe].bhandle)->blockpool).head + 3);
      pfVar19[-0xe].trie = (hbtrie *)0x115fe7;
      fdb_commit((fdb_file_handle *)pfVar19[-0xe].fileops,'\x01');
      pfVar19[-0xe].trie = (hbtrie *)0x115ff6;
      fdb_get_kvs_info((fdb_kvs_handle *)pfVar19[-0xe].file,
                       (fdb_kvs_info *)&pfVar19[-0xe].config.wal_threshold);
      pbVar7 = *(btreeblk_handle **)&pfVar19[-0xe].config.seqtree_opt;
      pfVar19[-0xe].bhandle = pbVar23;
      if (pbVar7 != pbVar23) {
        *(undefined4 *)&pfVar19[-0xe].staletree = 0;
        uVar21 = 0;
        pfVar19[-0xe].trie = (hbtrie *)0x116025;
        fdb_iterator_init((fdb_kvs_handle *)pfVar19[-0xe].file,
                          (fdb_iterator **)&pfVar19[-0xe].btreeblkops,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)&pfVar19[-0xe].staletree);
        do {
          pfVar19[-0xe].trie = (hbtrie *)0x116037;
          fdb_iterator_get((fdb_iterator *)pfVar19[-0xe].btreeblkops,
                           (fdb_doc **)&pfVar19[-0xe].config.buffercache_size);
          pfVar22 = (fdb_doc *)pfVar19[-0xe].config.buffercache_size;
          uVar21 = (ulong)((int)uVar21 + (pfVar22->deleted ^ 1));
          pfVar19[-0xe].trie = (hbtrie *)0x11604b;
          fdb_doc_free(pfVar22);
          pfVar19[-0xe].trie = (hbtrie *)0x116055;
          fVar11 = fdb_iterator_next((fdb_iterator *)pfVar19[-0xe].btreeblkops);
        } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
        pfVar19[-0xe].trie = (hbtrie *)0x116064;
        fdb_iterator_close((fdb_iterator *)pfVar19[-0xe].btreeblkops);
        pbVar23 = pfVar19[-0xe].bhandle;
        pfVar19[-0xe].trie = (hbtrie *)0x11607c;
        printf("dbdocs(%d) expected(%d)\n",uVar21,(ulong)pbVar23 & 0xffffffff);
      }
      if (*(btreeblk_handle **)&pfVar19[-0xe].config.seqtree_opt != pbVar23) {
        pfVar19[-0xe].trie = (hbtrie *)0x1160b9;
        iterator_set_del_docs_test();
      }
      lVar54 = 0;
      do {
        pfVar22 = *(fdb_doc **)((long)pfVar19 + lVar54 * 8 + -0x1a98);
        pfVar19[-0xe].trie = (hbtrie *)0x116092;
        fdb_doc_free(pfVar22);
        lVar54 = lVar54 + 1;
      } while (lVar54 != 100);
      iVar12 = *(int *)((long)&pfVar19[-0xe].dhandle + 4) + 1;
    } while (iVar12 != 0x14);
    pfVar19[-0xe].trie = (hbtrie *)0x1160c5;
    fdb_kvs_close((fdb_kvs_handle *)pfVar19[-0xe].file);
    pfVar19[-0xe].trie = (hbtrie *)0x1160cf;
    fdb_close((fdb_file_handle *)pfVar19[-0xe].fileops);
    pfVar19[-0xe].trie = (hbtrie *)0x1160d4;
    fdb_shutdown();
    pfVar19[-0xe].trie = (hbtrie *)0x1160d9;
    memleak_end();
    pcVar50 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar50 = "%s FAILED\n";
    }
    pfVar19[-0xe].trie = (hbtrie *)0x11610a;
    fprintf(_stderr,pcVar50,"iterator set del docs");
    return;
  }
  pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11332a;
  fVar11 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)&pfVar19[-3].max_seqnum,"prev KVS",
                        (fdb_kvs_config *)&pfVar19[-2].config.num_wal_partitions);
  pcVar49 = (char *)&stack0xfffffffffffffff8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150bc;
  pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x113350;
  fVar11 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key,"cur KVS",
                        (fdb_kvs_config *)&pfVar19[-2].config.num_wal_partitions);
  pcVar49 = (char *)&stack0xfffffffffffffff8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150c1;
  pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x113379;
  fVar11 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)&pfVar19[-3].shandle,"next KVS",
                        (fdb_kvs_config *)&pfVar19[-2].config.num_wal_partitions);
  pcVar49 = (char *)&stack0xfffffffffffffff8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150c6;
  pfVar19[-3].kv_info_offset = (uint64_t)pfVar18;
  pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
  *(void **)pcVar53 = (void *)0x79656b5f76657270;
  *(undefined1 *)&pfVar19[-2].config.max_writer_lock_prob = 0;
  pfVar18 = (fdb_kvs_handle *)&pfVar19[-3].filename;
  *(char **)pfVar18 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&pfVar19[-3].filename + 7) = 0x65756c;
  pcVar50 = (char *)pfVar19[-3].max_seqnum;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1133cf;
  sVar14 = strlen(pcVar53);
  pcVar52 = (char *)(sVar14 + 1);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1133db;
  sVar14 = strlen((char *)pfVar18);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1133f0;
  fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar53,(size_t)pcVar52,pfVar18,sVar14 + 1);
  pcVar49 = (char *)&stack0xfffffffffffffff8;
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150cb;
  unaff_R13 = (char *)0x79656b5f7478656e;
  pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
  *(void **)pcVar53 = (void *)0x79656b5f7478656e;
  *(undefined1 *)&pfVar19[-2].config.max_writer_lock_prob = 0;
  pcVar49 = (char *)0x6c61765f7478656e;
  pfVar18 = (fdb_kvs_handle *)&pfVar19[-3].filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&pfVar19[-3].filename + 7) = 0x65756c;
  pcVar50 = (char *)pfVar19[-3].shandle;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11343e;
  sVar14 = strlen(pcVar53);
  pcVar52 = (char *)(sVar14 + 1);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11344a;
  sVar14 = strlen((char *)pfVar18);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11345f;
  fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar53,(size_t)pcVar52,pfVar18,sVar14 + 1);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150d0;
  pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
  *(void **)pcVar53 = (void *)0x79656b5f7478656e;
  *(undefined2 *)&pfVar19[-2].config.max_writer_lock_prob = 0x32;
  pfVar18 = (fdb_kvs_handle *)&pfVar19[-3].filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&pfVar19[-3].txn = 0x326575;
  pcVar50 = (char *)pfVar19[-3].shandle;
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11349b;
  sVar14 = strlen(pcVar53);
  pcVar52 = (char *)(sVar14 + 1);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1134a7;
  sVar14 = strlen((char *)pfVar18);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1134bc;
  fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar53,(size_t)pcVar52,pfVar18,sVar14 + 1);
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150d5;
  pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1134d3;
  fVar11 = fdb_commit(pfVar2,'\x01');
  if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150da;
  if ((int)pfVar19[-3].kv_info_offset == 0) {
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    unaff_R13 = (char *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113519;
      sprintf((char *)pfVar18,"key%06d",(ulong)unaff_R13 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113529;
      sprintf(pcVar52,"value%08d",(ulong)unaff_R13 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113536;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113542;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113557;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011502c;
      *(undefined4 *)((long)pfVar19 + (long)unaff_R13 * 4 + -0x4f8) = 0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    } while ((uint8_t *)unaff_R13 != (uint8_t *)0x1e);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x113580;
    fVar11 = fdb_commit(pfVar2,'\x01');
    pfVar20 = (fdb_kvs_handle *)unaff_R13;
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115154;
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_001135f0:
      pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
      pcVar50 = "value%08d(WAL)";
      pcVar52 = (char *)&pfVar19[-3].filename;
      unaff_R13 = (char *)(fdb_kvs_handle *)0x0;
      do {
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11361e;
        sprintf((char *)pfVar18,"key%06d",(ulong)unaff_R13 & 0xffffffff);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11362e;
        sprintf(pcVar52,"value%08d(WAL)",(ulong)unaff_R13 & 0xffffffff);
        pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11363b;
        sVar14 = strlen((char *)pfVar18);
        pcVar53 = (char *)(sVar14 + 1);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x113647;
        sVar14 = strlen(pcVar52);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11365c;
        fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115031;
        *(undefined4 *)((long)pfVar19 + (long)unaff_R13 * 4 + -0x4f8) = 1;
        pfVar20 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x2;
        bVar59 = unaff_R13 < (fdb_kvs_handle *)0x1c;
        unaff_R13 = (char *)pfVar20;
      } while (bVar59);
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x113686;
      fVar11 = fdb_commit(pfVar2,'\0');
      if (fVar11 == FDB_RESULT_SUCCESS) {
LAB_0011368e:
        pfVar17 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
        *(uint *)&pfVar19[-3].config.max_writer_lock_prob =
             (uint)(*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) != 0) * 2;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1136b6;
        fVar11 = fdb_iterator_init(pfVar17,(fdb_iterator **)
                                           &pfVar19[-3].config.enable_background_compactor,
                                   (void *)0x0,0,(void *)0x0,0,
                                   (fdb_iterator_opt_t)pfVar19[-3].config.max_writer_lock_prob);
        unaff_R13 = (char *)pfVar20;
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150df;
        pcVar53 = (char *)&pfVar19[-3].config.num_bgflusher_threads;
        pcVar49 = "value%08d";
        pfVar18 = (fdb_kvs_handle *)&pfVar19[-3].filename;
        pcVar50 = (char *)0x0;
        do {
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1136e2;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)pcVar53);
          if (fVar11 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            uVar58 = (int)pcVar50 +
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pcVar50 * 4 + -0x4f8) == 2);
            pcVar50 = (char *)(ulong)uVar58;
            pcVar52 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11371d;
            sprintf((char *)pfVar18,pcVar52,(ulong)uVar58);
            pcVar52 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            sVar14 = ((fdb_doc *)pcVar52)->bodylen;
            unaff_R13 = (char *)((fdb_doc *)pcVar52)->body;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113737;
            iVar12 = bcmp(unaff_R13,pfVar18,sVar14);
            if (iVar12 != 0) goto LAB_00115060;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113747;
            fdb_doc_free((fdb_doc *)pcVar52);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pcVar50 = (char *)(ulong)(uVar58 + 1);
          }
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x11375d;
          fVar11 = fdb_iterator_next(pfVar13);
        } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar50 != 0x1e) goto LAB_001150e4;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11377a;
        fVar11 = fdb_iterator_prev(pfVar13);
        if (fVar11 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001150b2:
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1150b7;
          iterator_complete_test();
          goto LAB_001150b7;
        }
        pcVar53 = (char *)&pfVar19[-3].config.num_bgflusher_threads;
        pcVar49 = "value%08d";
        pfVar18 = (fdb_kvs_handle *)&pfVar19[-3].filename;
        do {
          uVar58 = (int)pcVar50 - 1;
          pcVar50 = (char *)(ulong)uVar58;
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1137a7;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)pcVar53);
          if (fVar11 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            uVar58 = uVar58 - (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) == 2);
            pcVar50 = (char *)(ulong)uVar58;
            pcVar52 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1137e2;
            sprintf((char *)pfVar18,pcVar52,(ulong)uVar58);
            pcVar52 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            sVar14 = ((fdb_doc *)pcVar52)->bodylen;
            unaff_R13 = (char *)((fdb_doc *)pcVar52)->body;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1137fc;
            iVar12 = bcmp(unaff_R13,pfVar18,sVar14);
            if (iVar12 != 0) goto LAB_00115070;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11380c;
            fdb_doc_free((fdb_doc *)pcVar52);
            pfVar19[-3].config.num_bgflusher_threads = 0;
          }
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x11381f;
          fVar11 = fdb_iterator_prev(pfVar13);
        } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar50 != 0) goto LAB_001150b2;
        pcVar50 = "key%06d";
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pfVar18 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar18 == (fdb_kvs_handle *)0x1e) goto LAB_00113950;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113865;
          sprintf(pcVar52,"key%06d",(ulong)pfVar18 & 0xffffffff);
          pcVar53 = *(char **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113872;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113883;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pcVar53,pcVar52,sVar14 + 1,'\0');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00114ffa;
          iVar12 = *(int *)((long)pfVar19 + (long)pfVar18 * 4 + -0x4f8);
          puVar1 = &(pfVar18->kvs_config).field_0x1;
          *(uint8_t **)(pfVar19[-3].config.encryption_key.bytes + 0x14) = puVar1;
          uVar21 = (ulong)puVar1 & 0xffffffff;
          if (iVar12 != 2) {
            uVar21 = (ulong)pfVar18 & 0xffffffff;
          }
          do {
            uVar58 = (uint)uVar21;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1138ad;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1138c4;
            sprintf(pcVar52,"key%06d",uVar21);
            uVar58 = uVar58 + (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) == 2);
            pcVar53 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar53 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1138f7;
            sprintf(pcVar49,pcVar53,(ulong)uVar58);
            pfVar18 = (fdb_kvs_handle *)pfVar19[-3].config.num_bgflusher_threads;
            pvVar57 = (pfVar18->kvs_config).custom_cmp_param;
            unaff_R13 = (char *)(pfVar18->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11390f;
            iVar12 = bcmp(unaff_R13,pcVar49,(size_t)pvVar57);
            if (iVar12 != 0) {
              pfVar19[-3].config.compaction_cb_ctx = (void *)0x114f8a;
              iterator_complete_test();
              goto LAB_00114f8a;
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11391f;
            fdb_doc_free((fdb_doc *)pfVar18);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            uVar58 = uVar58 + 1;
            uVar21 = (ulong)uVar58;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113934;
            fVar11 = fdb_iterator_next(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          pfVar18 = *(fdb_kvs_handle **)(pfVar19[-3].config.encryption_key.bytes + 0x14);
        } while (uVar58 == 0x1e);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x113950;
        iterator_complete_test();
LAB_00113950:
        pcVar50 = "key%06d";
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pfVar18 = (fdb_kvs_handle *)0x0;
        do {
          if (pfVar18 == (fdb_kvs_handle *)0x1e) goto LAB_00113a6f;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113984;
          sprintf(pcVar52,"key%06d",(ulong)pfVar18 & 0xffffffff);
          pcVar53 = *(char **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113991;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1139a2;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pcVar53,pcVar52,sVar14 + 1,'\0');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00114fff;
          iVar12 = *(int *)((long)pfVar19 + (long)pfVar18 * 4 + -0x4f8);
          puVar1 = &(pfVar18->kvs_config).field_0x1;
          *(uint8_t **)(pfVar19[-3].config.encryption_key.bytes + 0x14) = puVar1;
          uVar21 = (ulong)puVar1 & 0xffffffff;
          if (iVar12 != 2) {
            uVar21 = (ulong)pfVar18 & 0xffffffff;
          }
          do {
            uVar58 = (uint)uVar21;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1139cc;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1139e3;
            sprintf(pcVar52,"key%06d",uVar21);
            uVar58 = uVar58 - (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) == 2);
            pcVar53 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar53 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a16;
            sprintf(pcVar49,pcVar53,(ulong)uVar58);
            pfVar18 = (fdb_kvs_handle *)pfVar19[-3].config.num_bgflusher_threads;
            pvVar57 = (pfVar18->kvs_config).custom_cmp_param;
            unaff_R13 = (char *)(pfVar18->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a2e;
            iVar12 = bcmp(unaff_R13,pcVar49,(size_t)pvVar57);
            if (iVar12 != 0) goto LAB_00114f8a;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a3e;
            fdb_doc_free((fdb_doc *)pfVar18);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            uVar58 = uVar58 - 1;
            uVar21 = (ulong)uVar58;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a53;
            fVar11 = fdb_iterator_prev(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          pfVar18 = *(fdb_kvs_handle **)(pfVar19[-3].config.encryption_key.bytes + 0x14);
        } while (uVar58 == 0xffffffff);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a6f;
        iterator_complete_test();
LAB_00113a6f:
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pcVar53 = (char *)0x0;
        do {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113a94;
          sprintf(pcVar52,"key%06d",(ulong)pcVar53 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113aa1;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113ab5;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pcVar52,sVar14 + 1,'\x01');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115004;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)pcVar53 -
                           (uint)(*(int *)((long)pfVar19 + (long)pcVar53 * 4 + -0x4f8) == 2));
          do {
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113adc;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113af8;
            sprintf(pcVar52,"key%06d",pfVar18);
            uVar58 = (int)pfVar18 +
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar50 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113b2e;
            sprintf(pcVar49,pcVar50,(ulong)uVar58);
            unaff_R13 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            paVar3 = ((avl_node *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     parent;
            pcVar50 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113b46;
            iVar12 = bcmp(pcVar50,pcVar49,(size_t)paVar3);
            if (iVar12 != 0) goto LAB_00114f9a;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113b56;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 + 1);
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113b6c;
            fVar11 = fdb_iterator_next(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_00115009;
          pcVar53 = (char *)((long)&((fdb_iterator *)pcVar53)->handle + 1);
        } while ((fdb_iterator *)pcVar53 != (fdb_iterator *)0x1e);
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pcVar53 = (char *)0x0;
        do {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113bb1;
          sprintf(pcVar52,"key%06d",(ulong)pcVar53 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113bbe;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113bd2;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pcVar52,sVar14 + 1,'\x01');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011500e;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)pcVar53 -
                           (uint)(*(int *)((long)pfVar19 + (long)pcVar53 * 4 + -0x4f8) == 2));
          do {
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113bf9;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113c15;
            sprintf(pcVar52,"key%06d",pfVar18);
            uVar58 = (int)pfVar18 -
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar50 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113c4b;
            sprintf(pcVar49,pcVar50,(ulong)uVar58);
            unaff_R13 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            paVar3 = ((avl_node *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     parent;
            pcVar50 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113c63;
            iVar12 = bcmp(pcVar50,pcVar49,(size_t)paVar3);
            if (iVar12 != 0) goto LAB_00114faa;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113c73;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 - 1);
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113c89;
            fVar11 = fdb_iterator_prev(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_00115013;
          pcVar53 = (char *)((long)&((fdb_iterator *)pcVar53)->handle + 1);
        } while ((fdb_iterator *)pcVar53 != (fdb_iterator *)0x1e);
        pcVar50 = "key%06d+";
        pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        unaff_R13 = (char *)&pfVar19[-3].filename;
        uVar21 = 0;
        do {
          if (uVar21 == 0x1e) goto LAB_00113dc7;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113cdb;
          sprintf(pcVar53,"key%06d+",uVar21 & 0xffffffff);
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113ce8;
          sVar14 = strlen(pcVar53);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113cf9;
          fdb_iterator_seek(pfVar13,pcVar53,sVar14 + 1,'\0');
          iVar12 = *(int *)((long)pfVar19 + uVar21 * 4 + -0x4f4);
          *(ulong *)(pfVar19[-3].config.encryption_key.bytes + 0x14) = uVar21 + 1;
          uVar56 = (ulong)((int)uVar21 + 2);
          if (iVar12 != 2) {
            uVar56 = uVar21 + 1 & 0xffffffff;
          }
          do {
            uVar58 = (uint)uVar56;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113d1e;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113d36;
            sprintf(pcVar53,"key%06d+",uVar56);
            uVar58 = uVar58 + (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar49 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar49 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113d6c;
            sprintf(unaff_R13,pcVar49,(ulong)uVar58);
            pcVar49 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            pvVar57 = (((fdb_kvs_handle *)pcVar49)->kvs_config).custom_cmp_param;
            pcVar52 = (char *)(((fdb_kvs_handle *)pcVar49)->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113d84;
            iVar12 = bcmp(pcVar52,unaff_R13,(size_t)pvVar57);
            if (iVar12 != 0) goto LAB_00114fba;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113d94;
            fdb_doc_free((fdb_doc *)pcVar49);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            uVar58 = uVar58 + 1;
            uVar56 = (ulong)uVar58;
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113daa;
            fVar11 = fdb_iterator_next(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          uVar21 = *(ulong *)(pfVar19[-3].config.encryption_key.bytes + 0x14);
        } while (uVar58 == 0x1e);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x113dc7;
        iterator_complete_test();
LAB_00113dc7:
        pcVar50 = "key%06d+";
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        unaff_R13 = (char *)0x0;
        do {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113df1;
          sprintf(pcVar52,"key%06d+",(ulong)unaff_R13 & 0xffffffff);
          pcVar53 = *(char **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113dfe;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113e0f;
          fdb_iterator_seek((fdb_iterator *)pcVar53,pcVar52,sVar14 + 1,'\0');
          puVar1 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
          *(char **)(pfVar19[-3].config.encryption_key.bytes + 0x14) = unaff_R13;
          iVar12 = *(int *)((long)pfVar19 + (long)unaff_R13 * 4 + -0x4f4);
          pfVar19[-3].seqnum = (fdb_seqnum_t)puVar1;
          pfVar18 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 2);
          if (iVar12 != 2) {
            pfVar18 = (fdb_kvs_handle *)((ulong)puVar1 & 0xffffffff);
          }
          do {
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113e3d;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113e55;
            sprintf(pcVar52,"key%06d+",pfVar18);
            uVar58 = (int)pfVar18 -
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar53 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar53 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113e8b;
            sprintf(pcVar49,pcVar53,(ulong)uVar58);
            pcVar53 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            pbVar4 = ((fdb_iterator *)pcVar53)->seqtree_iterator;
            unaff_R13 = (char *)((fdb_iterator *)pcVar53)->tree_cursor_prev;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113ea3;
            iVar12 = bcmp(unaff_R13,pcVar49,(size_t)pbVar4);
            if (iVar12 != 0) goto LAB_00114fca;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113eb3;
            fdb_doc_free((fdb_doc *)pcVar53);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 - 1);
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113ec9;
            fVar11 = fdb_iterator_prev(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          if (*(long *)(pfVar19[-3].config.encryption_key.bytes + 0x14) == 0x1d) {
            if ((int)pfVar18 != 0x1e) goto LAB_00115036;
          }
          else if ((int)pfVar18 != -1) goto LAB_0011503b;
          unaff_R13 = (char *)pfVar19[-3].seqnum;
        } while ((fdb_kvs_handle *)unaff_R13 != (fdb_kvs_handle *)0x1e);
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pcVar53 = (char *)0x0;
        do {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113f26;
          sprintf(pcVar52,"key%06d+",(ulong)pcVar53 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113f33;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x113f47;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pcVar52,sVar14 + 1,'\x01');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115018;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)pcVar53 -
                           (uint)(*(int *)((long)pfVar19 + (long)pcVar53 * 4 + -0x4f8) == 2));
          do {
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113f6e;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113f8a;
            sprintf(pcVar52,"key%06d+",pfVar18);
            uVar58 = (int)pfVar18 +
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar50 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113fc0;
            sprintf(pcVar49,pcVar50,(ulong)uVar58);
            unaff_R13 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            paVar3 = ((avl_node *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     parent;
            pcVar50 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113fd8;
            iVar12 = bcmp(pcVar50,pcVar49,(size_t)paVar3);
            if (iVar12 != 0) goto LAB_00114fda;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113fe8;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 + 1);
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x113ffe;
            fVar11 = fdb_iterator_next(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_0011501d;
          pcVar53 = (char *)((long)&((fdb_iterator *)pcVar53)->handle + 1);
        } while ((fdb_iterator *)pcVar53 != (fdb_iterator *)0x1e);
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar49 = (char *)&pfVar19[-3].filename;
        pcVar53 = (char *)0x0;
        do {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114043;
          sprintf(pcVar52,"key%06d+",(ulong)pcVar53 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114050;
          sVar14 = strlen(pcVar52);
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114064;
          fVar11 = fdb_iterator_seek((fdb_iterator *)pfVar18,pcVar52,sVar14 + 1,'\x01');
          if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115022;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)pcVar53 -
                           (uint)(*(int *)((long)pfVar19 + (long)pcVar53 * 4 + -0x4f8) == 2));
          do {
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11408b;
            fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads)
            ;
            if (fVar11 != FDB_RESULT_SUCCESS) break;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1140a7;
            sprintf(pcVar52,"key%06d+",pfVar18);
            uVar58 = (int)pfVar18 -
                     (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
            pcVar50 = "value%08d";
            if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1140dd;
            sprintf(pcVar49,pcVar50,(ulong)uVar58);
            unaff_R13 = (char *)pfVar19[-3].config.num_bgflusher_threads;
            paVar3 = ((avl_node *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     parent;
            pcVar50 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x1140f5;
            iVar12 = bcmp(pcVar50,pcVar49,(size_t)paVar3);
            if (iVar12 != 0) goto LAB_00114fea;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x114105;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar19[-3].config.num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 - 1);
            pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
            pfVar19[-3].config.compaction_cb_ctx = (void *)0x11411b;
            fVar11 = fdb_iterator_prev(pfVar13);
          } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_00115027;
          pcVar53 = (char *)((long)&((fdb_iterator *)pcVar53)->handle + 1);
        } while ((fdb_iterator *)pcVar53 != (fdb_iterator *)0x1e);
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114145;
        fVar11 = fdb_iterator_seek_to_min(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150e9;
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar50 = "value%08d";
        unaff_R13 = (char *)&pfVar19[-3].filename;
        pfVar18 = (fdb_kvs_handle *)0x0;
        do {
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114176;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads);
          if (fVar11 != FDB_RESULT_SUCCESS) break;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114192;
          sprintf(pcVar52,"key%06d+",pfVar18);
          uVar58 = (int)pfVar18 +
                   (uint)(*(int *)((long)pfVar19 + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
          pfVar18 = (fdb_kvs_handle *)(ulong)uVar58;
          pcVar49 = "value%08d";
          if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
            pcVar49 = "value%08d(WAL)";
          }
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1141c4;
          sprintf(unaff_R13,pcVar49,(ulong)uVar58);
          pcVar49 = (char *)pfVar19[-3].config.num_bgflusher_threads;
          pvVar57 = (((fdb_kvs_handle *)pcVar49)->kvs_config).custom_cmp_param;
          pcVar53 = (char *)(((fdb_kvs_handle *)pcVar49)->field_6).seqtree;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1141dc;
          iVar12 = bcmp(pcVar53,unaff_R13,(size_t)pvVar57);
          if (iVar12 != 0) goto LAB_00115040;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1141ec;
          fdb_doc_free((fdb_doc *)pcVar49);
          pfVar19[-3].config.num_bgflusher_threads = 0;
          pfVar18 = (fdb_kvs_handle *)(ulong)(uVar58 + 1);
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114202;
          fVar11 = fdb_iterator_next(pfVar13);
        } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar18 != 0x1e) goto LAB_001150ee;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11421f;
        fVar11 = fdb_iterator_seek_to_max(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
        pcVar53 = (char *)0x1d;
        pcVar52 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pcVar50 = "value%08d";
        unaff_R13 = (char *)&pfVar19[-3].filename;
        do {
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114252;
          fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads);
          if (fVar11 != FDB_RESULT_SUCCESS) break;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x11426d;
          sprintf(pcVar52,"key%06d+",pcVar53);
          uVar58 = (int)pcVar53 -
                   (uint)(*(int *)((long)pfVar19 + (long)(int)pcVar53 * 4 + -0x4f8) == 2);
          pcVar53 = (char *)(ulong)uVar58;
          pcVar49 = "value%08d";
          if (*(int *)((long)pfVar19 + (long)(int)uVar58 * 4 + -0x4f8) != 0) {
            pcVar49 = "value%08d(WAL)";
          }
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x11429c;
          sprintf(unaff_R13,pcVar49,(ulong)uVar58);
          pcVar49 = (char *)pfVar19[-3].config.num_bgflusher_threads;
          pvVar57 = (((fdb_kvs_handle *)pcVar49)->kvs_config).custom_cmp_param;
          pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar49)->field_6).seqtree;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1142b4;
          iVar12 = bcmp(pfVar18,unaff_R13,(size_t)pvVar57);
          if (iVar12 != 0) goto LAB_00115050;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1142c4;
          fdb_doc_free((fdb_doc *)pcVar49);
          pfVar19[-3].config.num_bgflusher_threads = 0;
          pcVar53 = (char *)(ulong)(uVar58 - 1);
          pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1142d9;
          fVar11 = fdb_iterator_prev(pfVar13);
        } while (fVar11 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pcVar53 != -1) goto LAB_001150f8;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1142f5;
        fVar11 = fdb_iterator_close(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
        pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11431b;
        sprintf(pcVar53,"key%06d",0x14);
        pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114328;
        sVar14 = strlen(pcVar53);
        *(undefined4 *)&pfVar19[-3].config.max_writer_lock_prob = 8;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114347;
        fVar11 = fdb_iterator_init(pfVar18,(fdb_iterator **)
                                           &pfVar19[-3].config.enable_background_compactor,
                                   (void *)0x0,0,pcVar53,sVar14 + 1,
                                   (fdb_iterator_opt_t)pfVar19[-3].config.max_writer_lock_prob);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115102;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114359;
        fVar11 = fdb_iterator_seek_to_max(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115107;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114370;
        fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011510c;
        unaff_R13 = "value%08d";
        pcVar53 = "value%08d(WAL)";
        pcVar50 = "value%08d(WAL)";
        if (*(int *)((long)&pfVar19[-3].log_callback.callback + 4) == 0) {
          pcVar50 = "value%08d";
        }
        pcVar52 = (char *)&pfVar19[-3].filename;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1143ac;
        sprintf(pcVar52,pcVar50,0x13);
        pfVar18 = (fdb_kvs_handle *)pfVar19[-3].config.num_bgflusher_threads;
        pvVar57 = (pfVar18->kvs_config).custom_cmp_param;
        pcVar50 = (char *)(pfVar18->field_6).seqtree;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1143c4;
        iVar12 = bcmp(pcVar50,pcVar52,(size_t)pvVar57);
        if (iVar12 != 0) goto LAB_00115111;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1143d4;
        fdb_doc_free((fdb_doc *)pfVar18);
        pfVar19[-3].config.num_bgflusher_threads = 0;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1143e7;
        fVar11 = fdb_iterator_close(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115121;
        pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11440d;
        sprintf((char *)pfVar18,"key%06d",10);
        pcVar50 = *(char **)&pfVar19[-3].config.encryption_key;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11441a;
        sVar14 = strlen((char *)pfVar18);
        *(undefined4 *)&pfVar19[-3].config.max_writer_lock_prob = 4;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11443b;
        fVar11 = fdb_iterator_init((fdb_kvs_handle *)pcVar50,
                                   (fdb_iterator **)&pfVar19[-3].config.enable_background_compactor,
                                   pfVar18,sVar14 + 1,(void *)0x0,0,
                                   (fdb_iterator_opt_t)pfVar19[-3].config.max_writer_lock_prob);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115126;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11444d;
        fVar11 = fdb_iterator_seek_to_min(pfVar13);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011512b;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114464;
        fVar11 = fdb_iterator_get(pfVar13,(fdb_doc **)&pfVar19[-3].config.num_bgflusher_threads);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115130;
        if (*(int *)((long)&pfVar19[-3].config.breakpad_minidump_dir + 4) == 0) {
          pcVar53 = "value%08d";
        }
        pcVar50 = (char *)&pfVar19[-3].filename;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x11448f;
        sprintf(pcVar50,pcVar53,0xb);
        pcVar53 = (char *)pfVar19[-3].config.num_bgflusher_threads;
        pbVar4 = ((fdb_iterator *)pcVar53)->seqtree_iterator;
        pfVar18 = (fdb_kvs_handle *)((fdb_iterator *)pcVar53)->tree_cursor_prev;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144a7;
        iVar12 = bcmp(pfVar18,pcVar50,(size_t)pbVar4);
        if (iVar12 != 0) goto LAB_00115135;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144b7;
        fdb_doc_free((fdb_doc *)pcVar53);
        pfVar19[-3].config.num_bgflusher_threads = 0;
        pfVar13 = *(fdb_iterator **)&pfVar19[-3].config.enable_background_compactor;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144ca;
        fVar11 = fdb_iterator_close(pfVar13);
        pcVar53 = (char *)pfVar19[-3].kv_info_offset;
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115145;
        pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144e4;
        fVar11 = fdb_close(pfVar2);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011514a;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144f1;
        fVar11 = fdb_shutdown();
        if (fVar11 == FDB_RESULT_SUCCESS) {
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x1144fe;
          memleak_end();
          pfVar19[-2].bub_ctx.entries = (list *)0x20747365742065;
          pfVar19[-2].node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&pfVar19[-2].num_iterators = 0x74656c706d6f6320;
          if ((int)pcVar53 != 0) goto LAB_0011472c;
          pfVar19[-3].config.compaction_cb_ctx = (void *)0x114534;
          sVar14 = strlen((char *)&pfVar19[-2].node);
          builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: all, W",0x10);
          uVar60._0_1_ = ' ';
          uVar60._1_1_ = 'a';
          uVar60._2_1_ = 'l';
          uVar60._3_1_ = 'l';
          uVar62._0_1_ = ',';
          uVar62._1_1_ = ' ';
          uVar62._2_1_ = 'W';
          uVar62._3_1_ = 'A';
          uVar64._0_1_ = 'L';
          uVar64._1_1_ = ':';
          uVar64._2_1_ = ' ';
          uVar64._3_1_ = 'e';
          uVar66._0_1_ = 'v';
          uVar66._1_1_ = 'e';
          uVar66._2_1_ = 'n';
          uVar66._3_1_ = '\0';
          goto LAB_0011454a;
        }
        goto LAB_0011514f;
      }
      goto LAB_00115159;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1135ad;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1135ba;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1135c9;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011515e;
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x1135e0;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_001135f0;
    }
    goto LAB_00115163;
  }
  switch((int)pfVar19[-3].kv_info_offset) {
  case 1:
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1145c6;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar20 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1145d6;
      sprintf(pcVar52,"value%08d",(ulong)pfVar20 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1145e3;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1145ef;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114604;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115080;
      *(undefined4 *)((long)pfVar19 + (long)pfVar20 * 4 + -0x4f8) = 0;
      pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).field_0x1;
    } while (pfVar20 != (fdb_kvs_handle *)0x1e);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11462d;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115168;
    pcVar50 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar52 = "value%08d(WAL)";
    pfVar20 = (fdb_kvs_handle *)&pfVar19[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x1;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114666;
      sprintf(pcVar50,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114676;
      sprintf((char *)pfVar20,"value%08d(WAL)",(ulong)pfVar17 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114683;
      sVar14 = strlen(pcVar50);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x11468f;
      sVar14 = strlen((char *)pfVar20);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1146a4;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pcVar50,(size_t)pcVar53,pfVar20,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011509e;
      *(undefined4 *)((long)pfVar19 + (long)pfVar17 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x2;
      bVar59 = pfVar17 < (fdb_kvs_handle *)0x1c;
      pfVar17 = pfVar18;
    } while (bVar59);
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) != 0) {
      pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1146e7;
      sprintf(pcVar53,"key%06d",0xf);
      pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1146f4;
      sVar14 = strlen(pcVar53);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114703;
      fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
      if (fVar11 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
        goto LAB_00114713;
      }
      goto LAB_0011519a;
    }
LAB_00114713:
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11471f;
    fVar11 = fdb_commit(pfVar2,'\0');
    if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11472c;
    iterator_complete_test();
    break;
  case 2:
switchD_00114596_caseD_2:
    pcVar50 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar52 = "value%08d";
    pfVar20 = (fdb_kvs_handle *)&pfVar19[-3].filename;
    pfVar18 = (fdb_kvs_handle *)0x1;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b97;
      sprintf(pcVar50,"key%06d",(ulong)pfVar18 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ba7;
      sprintf((char *)pfVar20,"value%08d",(ulong)pfVar18 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114bb4;
      sVar14 = strlen(pcVar50);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114bc0;
      sVar14 = strlen((char *)pfVar20);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114bd5;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pcVar50,(size_t)pcVar53,pfVar20,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115094;
      *(undefined4 *)((long)pfVar19 + (long)pfVar18 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
      bVar59 = pfVar18 < (fdb_kvs_handle *)0x1c;
      pfVar18 = pfVar17;
    } while (bVar59);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114c02;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011517c;
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114c72:
      pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
      pcVar50 = "value%08d(WAL)";
      pcVar52 = (char *)&pfVar19[-3].filename;
      unaff_R13 = (char *)(fdb_kvs_handle *)0x0;
      do {
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ca0;
        sprintf((char *)pfVar18,"key%06d",(ulong)unaff_R13 & 0xffffffff);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114cb0;
        sprintf(pcVar52,"value%08d(WAL)",(ulong)unaff_R13 & 0xffffffff);
        pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114cbd;
        sVar14 = strlen((char *)pfVar18);
        pcVar53 = (char *)(sVar14 + 1);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114cc9;
        sVar14 = strlen(pcVar52);
        pfVar19[-3].config.compaction_cb_ctx = (void *)0x114cde;
        fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
        if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150ad;
        *(undefined4 *)((long)pfVar19 + (long)unaff_R13 * 4 + -0x4f8) = 1;
        pfVar20 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x2;
        bVar59 = unaff_R13 < (fdb_kvs_handle *)0x1c;
        unaff_R13 = (char *)pfVar20;
      } while (bVar59);
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d08;
      fVar11 = fdb_commit(pfVar2,'\0');
      if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d15;
      iterator_complete_test();
      goto switchD_00114596_default;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114c2f;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114c3c;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114c4b;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115190;
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114c62;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114c72;
    }
    goto LAB_00115195;
  case 3:
switchD_00114596_caseD_3:
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1148f2;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114902;
      sprintf(pcVar52,"value%08d",(ulong)pfVar17 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x11490f;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x11491b;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114930;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011508a;
      *(undefined4 *)((long)pfVar19 + (long)pfVar17 * 4 + -0x4f8) = 0;
      pfVar20 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x2;
      bVar59 = pfVar17 < (fdb_kvs_handle *)0x1c;
      pfVar17 = pfVar20;
    } while (bVar59);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11495d;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115172;
    pcVar50 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar52 = "value%08d(WAL)";
    pfVar20 = (fdb_kvs_handle *)&pfVar19[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x1;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114996;
      sprintf(pcVar50,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1149a6;
      sprintf((char *)pfVar20,"value%08d(WAL)",(ulong)pfVar17 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1149b3;
      sVar14 = strlen(pcVar50);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1149bf;
      sVar14 = strlen((char *)pfVar20);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1149d4;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pcVar50,(size_t)pcVar53,pfVar20,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150a3;
      *(undefined4 *)((long)pfVar19 + (long)pfVar17 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x2;
      bVar59 = pfVar17 < (fdb_kvs_handle *)0x1c;
      pfVar17 = pfVar18;
    } while (bVar59);
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114a43:
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a4f;
      fVar11 = fdb_commit(pfVar2,'\0');
      if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a5c;
      iterator_complete_test();
      goto switchD_00114596_caseD_4;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a17;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a24;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a33;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114a43;
    }
    goto LAB_0011519f;
  case 4:
switchD_00114596_caseD_4:
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a8a;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar20 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114a9a;
      sprintf(pcVar52,"value%08d",(ulong)pfVar20 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114aa7;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ab3;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ac8;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011508f;
      *(undefined4 *)((long)pfVar19 + (long)pfVar20 * 4 + -0x4f8) = 0;
      pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).field_0x1;
    } while (pfVar20 != (fdb_kvs_handle *)0x1e);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114af1;
    fVar11 = fdb_commit(pfVar2,'\x01');
    pfVar17 = pfVar18;
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115177;
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114b4a:
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b59;
      fVar11 = fdb_commit(pfVar2,'\x01');
      if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b66;
      iterator_complete_test();
      goto switchD_00114596_caseD_2;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b1e;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b2b;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114b3a;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114b4a;
    }
    goto LAB_0011518b;
  case 5:
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1147ee;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar20 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1147fe;
      sprintf(pcVar52,"value%08d",(ulong)pfVar20 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x11480b;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114817;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x11482c;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115085;
      *(undefined4 *)((long)pfVar19 + (long)pfVar20 * 4 + -0x4f8) = 0;
      pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).field_0x1;
    } while (pfVar20 != (fdb_kvs_handle *)0x1e);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114852;
    fVar11 = fdb_commit(pfVar2,'\0');
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_0011516d;
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_001148ab:
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1148b7;
      fVar11 = fdb_commit(pfVar2,'\0');
      if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x1148c4;
      iterator_complete_test();
      goto switchD_00114596_caseD_3;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11487f;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11488c;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x11489b;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_001148ab;
    }
    goto LAB_00115186;
  default:
switchD_00114596_default:
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d43;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar20 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d53;
      sprintf(pcVar52,"value%08d",(ulong)pfVar20 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d60;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d6c;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114d81;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      pfVar17 = pfVar18;
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115099;
      *(undefined4 *)((long)pfVar19 + (long)pfVar20 * 4 + -0x4f8) = 0;
      pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).field_0x1;
    } while (pfVar20 != (fdb_kvs_handle *)0x1e);
    pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114daa;
    fVar11 = fdb_commit(pfVar2,'\x01');
    if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_00115181;
    pfVar18 = (fdb_kvs_handle *)&pfVar19[-2].config.compaction_cb_ctx;
    pcVar50 = "value%08d(WAL)";
    pcVar52 = (char *)&pfVar19[-3].filename;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114de0;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar20 & 0xffffffff);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114df0;
      sprintf(pcVar52,"value%08d(WAL)",(ulong)pfVar20 & 0xffffffff);
      pcVar49 = *(char **)&pfVar19[-3].config.encryption_key;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114dfd;
      sVar14 = strlen((char *)pfVar18);
      pcVar53 = (char *)(sVar14 + 1);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e09;
      sVar14 = strlen(pcVar52);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e1e;
      fVar11 = fdb_set_kv((fdb_kvs_handle *)pcVar49,pfVar18,(size_t)pcVar53,pcVar52,sVar14 + 1);
      unaff_R13 = (char *)pfVar20;
      if (fVar11 != FDB_RESULT_SUCCESS) goto LAB_001150a8;
      *(undefined4 *)((long)pfVar19 + (long)pfVar20 * 4 + -0x4f8) = 1;
      pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).field_0x1;
    } while (pfVar20 != (fdb_kvs_handle *)0x1e);
    if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114e89:
      pfVar2 = *(fdb_file_handle **)(pfVar19[-3].config.encryption_key.bytes + 4);
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e95;
      fVar11 = fdb_commit(pfVar2,'\0');
      if (fVar11 == FDB_RESULT_SUCCESS) goto LAB_0011368e;
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ea2;
      iterator_complete_test();
switchD_00114745_caseD_5:
      pfVar19[-3].config.compaction_cb_ctx = (void *)0x114eaf;
      sVar14 = strlen((char *)&pfVar19[-2].node);
      builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: empty,",0x10);
      uVar61._0_1_ = 'e';
      uVar61._1_1_ = 'm';
      uVar61._2_1_ = 'p';
      uVar61._3_1_ = 't';
      uVar63._0_1_ = 'y';
      uVar63._1_1_ = ',';
      uVar63._2_1_ = ' ';
      uVar63._3_1_ = 'W';
      uVar65._0_1_ = 'A';
      uVar65._1_1_ = 'L';
      uVar65._2_1_ = ':';
      uVar65._3_1_ = ' ';
      uVar67._0_1_ = 'a';
      uVar67._1_1_ = 'l';
      uVar67._2_1_ = 'l';
      uVar67._3_1_ = '\0';
LAB_00114f12:
      pcVar50 = (char *)((long)pfVar19 + (sVar14 - 0x22e));
      *(undefined4 *)pcVar50 = uVar61;
      *(undefined4 *)(pcVar50 + 4) = uVar63;
      *(undefined4 *)(pcVar50 + 8) = uVar65;
      *(undefined4 *)(pcVar50 + 0xc) = uVar67;
      goto switchD_00114745_default;
    }
    pcVar53 = (char *)&pfVar19[-2].config.compaction_cb_ctx;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e5d;
    sprintf(pcVar53,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)&pfVar19[-3].config.encryption_key;
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e6a;
    sVar14 = strlen(pcVar53);
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114e79;
    fVar11 = fdb_del_kv(pfVar18,pcVar53,sVar14 + 1);
    if (fVar11 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar19[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114e89;
    }
    goto LAB_001151a4;
  }
LAB_0011472c:
  switch((int)pcVar53) {
  case 1:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114754;
    sVar14 = strlen((char *)&pfVar19[-2].node);
    *(undefined8 *)((long)pfVar19 + (sVar14 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114f2c;
    sVar14 = strlen((char *)&pfVar19[-2].node);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar60._0_1_ = ' ';
    uVar60._1_1_ = 'o';
    uVar60._2_1_ = 'd';
    uVar60._3_1_ = 'd';
    uVar62._0_1_ = ',';
    uVar62._1_1_ = ' ';
    uVar62._2_1_ = 'W';
    uVar62._3_1_ = 'A';
    uVar64._0_1_ = 'L';
    uVar64._1_1_ = ':';
    uVar64._2_1_ = ' ';
    uVar64._3_1_ = 'e';
    uVar66._0_1_ = 'v';
    uVar66._1_1_ = 'e';
    uVar66._2_1_ = 'n';
    uVar66._3_1_ = '\0';
    goto LAB_0011454a;
  case 3:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114ed4;
    sVar14 = strlen((char *)&pfVar19[-2].node);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: even, ",0x10);
    uVar60._0_1_ = ' ';
    uVar60._1_1_ = 'e';
    uVar60._2_1_ = 'v';
    uVar60._3_1_ = 'e';
    uVar62._0_1_ = 'n';
    uVar62._1_1_ = ',';
    uVar62._2_1_ = ' ';
    uVar62._3_1_ = 'W';
    uVar64._0_1_ = 'A';
    uVar64._1_1_ = 'L';
    uVar64._2_1_ = ':';
    uVar64._3_1_ = ' ';
    uVar66._0_1_ = 'o';
    uVar66._1_1_ = 'd';
    uVar66._2_1_ = 'd';
    uVar66._3_1_ = '\0';
LAB_0011454a:
    pcVar50 = (char *)((long)pfVar19 + (sVar14 - 0x22f));
    *(undefined4 *)pcVar50 = uVar60;
    *(undefined4 *)(pcVar50 + 4) = uVar62;
    *(undefined4 *)(pcVar50 + 8) = uVar64;
    *(undefined4 *)(pcVar50 + 0xc) = uVar66;
    goto switchD_00114745_default;
  case 4:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114efc;
    sVar14 = strlen((char *)&pfVar19[-2].node);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: all, W",0x10);
    uVar61._0_1_ = 'a';
    uVar61._1_1_ = 'l';
    uVar61._2_1_ = 'l';
    uVar61._3_1_ = ',';
    uVar63._0_1_ = ' ';
    uVar63._1_1_ = 'W';
    uVar63._2_1_ = 'A';
    uVar63._3_1_ = 'L';
    uVar65._0_1_ = ':';
    uVar65._1_1_ = ' ';
    uVar65._2_1_ = 'e';
    uVar65._3_1_ = 'm';
    uVar67._0_1_ = 'p';
    uVar67._1_1_ = 't';
    uVar67._2_1_ = 'y';
    uVar67._3_1_ = '\0';
    goto LAB_00114f12;
  case 5:
    goto switchD_00114745_caseD_5;
  case 6:
    pfVar19[-3].config.compaction_cb_ctx = (void *)0x114f54;
    sVar14 = strlen((char *)&pfVar19[-2].node);
    *(undefined8 *)((long)pfVar19 + (sVar14 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_00114745_default;
  }
  builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x238)),"(HB+trie: all, W",0x10);
switchD_00114745_default:
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x11455f;
  sVar14 = strlen((char *)&pfVar19[-2].node);
  pcVar50 = (char *)((long)pfVar19 + (sVar14 - 0x238));
  if (*(int *)(pfVar19[-3].config.encryption_key.bytes + 0x10) == 0) {
    pcVar50[0] = ')';
    pcVar50[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar50,", do",4);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x234)),"c de",4);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x230)),"leti",4);
    builtin_strncpy((char *)((long)pfVar19 + (sVar14 - 0x22c)),"on)",4);
  }
  pcVar50 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar50 = "%s FAILED\n";
  }
  pfVar19[-3].config.compaction_cb_ctx = (void *)0x1147ae;
  fprintf(_stderr,pcVar50,&pfVar19[-2].node);
  return;
}

Assistant:

void iterator_seek_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes before compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert documents of odd number into the main (default) KV store handle
    for (i=1;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents of even number
    for (i=0;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now odd number docs are in hb-trie & even number docs are in WAL

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key in the trie...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek to max using a non-existent FFFF key
    if (status == FDB_RESULT_SUCCESS) {
        uint8_t *big_seek_key = alca(uint8_t, FDB_MAX_KEYLEN);
        memset(big_seek_key, 0xff, FDB_MAX_KEYLEN);
        status = fdb_iterator_seek(iterator, big_seek_key, FDB_MAX_KEYLEN,
                                   FDB_ITR_SEEK_LOWER);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i = n - 1;
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // delete documents of even number so WAL only has deleted docs
    for (i=0;i<n;i+=2){
        status = fdb_del(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek forward to 2nd key ..
    rdoc = NULL;
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek test");
}